

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx512::CurveNiIntersectorK<8,8>::
     intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float fVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  uint uVar7;
  uint uVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  void *pvVar11;
  __int_type_conflict _Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  byte bVar35;
  uint uVar36;
  ulong uVar37;
  long lVar39;
  uint uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined8 in_R10;
  bool bVar44;
  bool bVar45;
  bool bVar46;
  bool bVar47;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar99 [32];
  undefined1 auVar101 [32];
  undefined1 auVar103 [32];
  undefined1 auVar105 [32];
  undefined1 auVar107 [32];
  float fVar109;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar114;
  float fVar115;
  float fVar116;
  float t1;
  undefined4 uVar117;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  float fVar126;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  float fVar134;
  float fVar141;
  float fVar142;
  float fVar143;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  vfloat4 b0;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  vfloat4 b0_1;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  vfloat4 a0_2;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [32];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  float fVar199;
  float fVar208;
  float fVar209;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar210;
  float fVar221;
  float fVar222;
  vfloat4 a0_1;
  undefined1 auVar211 [16];
  float fVar223;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  float fVar224;
  float fVar228;
  float fVar229;
  vfloat4 a0;
  float fVar230;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [32];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  undefined1 in_ZMM30 [64];
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  RTCFilterFunctionNArguments local_460;
  uint auStack_430 [4];
  undefined1 local_420 [32];
  undefined1 local_3f0 [8];
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [8];
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [16];
  undefined1 local_350 [8];
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  undefined1 local_290 [16];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined8 uStack_240;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar38;
  undefined1 auVar98 [32];
  undefined1 auVar100 [32];
  undefined1 auVar102 [32];
  undefined1 auVar104 [32];
  undefined1 auVar106 [32];
  undefined1 auVar108 [32];
  undefined1 auVar235 [32];
  
  uVar37 = (ulong)(byte)prim[1];
  fVar1 = *(float *)(prim + uVar37 * 0x19 + 0x12);
  auVar48 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar48 = vinsertps_avx(auVar48,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar58 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar50 = vinsertps_avx(auVar58,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar60 = vsubps_avx(auVar48,*(undefined1 (*) [16])(prim + uVar37 * 0x19 + 6));
  fVar126 = fVar1 * auVar60._0_4_;
  fVar109 = fVar1 * auVar50._0_4_;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *(ulong *)(prim + uVar37 * 4 + 6);
  auVar82 = vpmovsxbd_avx2(auVar48);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar58._8_8_ = 0;
  auVar58._0_8_ = *(ulong *)(prim + uVar37 * 5 + 6);
  auVar80 = vpmovsxbd_avx2(auVar58);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar37 * 6 + 6);
  auVar81 = vpmovsxbd_avx2(auVar4);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = *(ulong *)(prim + uVar37 * 0xb + 6);
  auVar92 = vpmovsxbd_avx2(auVar57);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = *(ulong *)(prim + uVar37 * 0xc + 6);
  auVar93 = vpmovsxbd_avx2(auVar56);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = *(ulong *)(prim + uVar37 * 0xd + 6);
  auVar83 = vpmovsxbd_avx2(auVar55);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar59._8_8_ = 0;
  auVar59._0_8_ = *(ulong *)(prim + uVar37 * 0x12 + 6);
  auVar84 = vpmovsxbd_avx2(auVar59);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *(ulong *)(prim + uVar37 * 0x13 + 6);
  auVar87 = vpmovsxbd_avx2(auVar54);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar37 * 0x14 + 6);
  auVar78 = vpmovsxbd_avx2(auVar5);
  auVar85 = vcvtdq2ps_avx(auVar87);
  auVar86 = vcvtdq2ps_avx(auVar78);
  auVar138._4_4_ = fVar109;
  auVar138._0_4_ = fVar109;
  auVar138._8_4_ = fVar109;
  auVar138._12_4_ = fVar109;
  auVar138._16_4_ = fVar109;
  auVar138._20_4_ = fVar109;
  auVar138._24_4_ = fVar109;
  auVar138._28_4_ = fVar109;
  auVar241._8_4_ = 1;
  auVar241._0_8_ = 0x100000001;
  auVar241._12_4_ = 1;
  auVar241._16_4_ = 1;
  auVar241._20_4_ = 1;
  auVar241._24_4_ = 1;
  auVar241._28_4_ = 1;
  auVar88 = ZEXT1632(CONCAT412(fVar1 * auVar50._12_4_,
                               CONCAT48(fVar1 * auVar50._8_4_,
                                        CONCAT44(fVar1 * auVar50._4_4_,fVar109))));
  auVar79 = vpermps_avx2(auVar241,auVar88);
  auVar76 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar249 = ZEXT3264(auVar76);
  auVar77 = vpermps_avx512vl(auVar76,auVar88);
  fVar109 = auVar77._0_4_;
  fVar199 = auVar77._4_4_;
  auVar88._4_4_ = fVar199 * auVar81._4_4_;
  auVar88._0_4_ = fVar109 * auVar81._0_4_;
  fVar208 = auVar77._8_4_;
  auVar88._8_4_ = fVar208 * auVar81._8_4_;
  fVar209 = auVar77._12_4_;
  auVar88._12_4_ = fVar209 * auVar81._12_4_;
  fVar114 = auVar77._16_4_;
  auVar88._16_4_ = fVar114 * auVar81._16_4_;
  fVar115 = auVar77._20_4_;
  auVar88._20_4_ = fVar115 * auVar81._20_4_;
  fVar116 = auVar77._24_4_;
  auVar88._24_4_ = fVar116 * auVar81._24_4_;
  auVar88._28_4_ = auVar78._28_4_;
  auVar78._4_4_ = auVar83._4_4_ * fVar199;
  auVar78._0_4_ = auVar83._0_4_ * fVar109;
  auVar78._8_4_ = auVar83._8_4_ * fVar208;
  auVar78._12_4_ = auVar83._12_4_ * fVar209;
  auVar78._16_4_ = auVar83._16_4_ * fVar114;
  auVar78._20_4_ = auVar83._20_4_ * fVar115;
  auVar78._24_4_ = auVar83._24_4_ * fVar116;
  auVar78._28_4_ = auVar87._28_4_;
  auVar87._4_4_ = auVar86._4_4_ * fVar199;
  auVar87._0_4_ = auVar86._0_4_ * fVar109;
  auVar87._8_4_ = auVar86._8_4_ * fVar208;
  auVar87._12_4_ = auVar86._12_4_ * fVar209;
  auVar87._16_4_ = auVar86._16_4_ * fVar114;
  auVar87._20_4_ = auVar86._20_4_ * fVar115;
  auVar87._24_4_ = auVar86._24_4_ * fVar116;
  auVar87._28_4_ = auVar77._28_4_;
  auVar48 = vfmadd231ps_fma(auVar88,auVar79,auVar80);
  auVar58 = vfmadd231ps_fma(auVar78,auVar79,auVar93);
  auVar4 = vfmadd231ps_fma(auVar87,auVar85,auVar79);
  auVar48 = vfmadd231ps_fma(ZEXT1632(auVar48),auVar138,auVar82);
  auVar58 = vfmadd231ps_fma(ZEXT1632(auVar58),auVar138,auVar92);
  auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar84,auVar138);
  auVar150._4_4_ = fVar126;
  auVar150._0_4_ = fVar126;
  auVar150._8_4_ = fVar126;
  auVar150._12_4_ = fVar126;
  auVar150._16_4_ = fVar126;
  auVar150._20_4_ = fVar126;
  auVar150._24_4_ = fVar126;
  auVar150._28_4_ = fVar126;
  auVar78 = ZEXT1632(CONCAT412(fVar1 * auVar60._12_4_,
                               CONCAT48(fVar1 * auVar60._8_4_,
                                        CONCAT44(fVar1 * auVar60._4_4_,fVar126))));
  auVar87 = vpermps_avx2(auVar241,auVar78);
  auVar78 = vpermps_avx512vl(auVar76,auVar78);
  auVar79 = vmulps_avx512vl(auVar78,auVar81);
  auVar90._0_4_ = auVar78._0_4_ * auVar83._0_4_;
  auVar90._4_4_ = auVar78._4_4_ * auVar83._4_4_;
  auVar90._8_4_ = auVar78._8_4_ * auVar83._8_4_;
  auVar90._12_4_ = auVar78._12_4_ * auVar83._12_4_;
  auVar90._16_4_ = auVar78._16_4_ * auVar83._16_4_;
  auVar90._20_4_ = auVar78._20_4_ * auVar83._20_4_;
  auVar90._24_4_ = auVar78._24_4_ * auVar83._24_4_;
  auVar90._28_4_ = 0;
  auVar83._4_4_ = auVar78._4_4_ * auVar86._4_4_;
  auVar83._0_4_ = auVar78._0_4_ * auVar86._0_4_;
  auVar83._8_4_ = auVar78._8_4_ * auVar86._8_4_;
  auVar83._12_4_ = auVar78._12_4_ * auVar86._12_4_;
  auVar83._16_4_ = auVar78._16_4_ * auVar86._16_4_;
  auVar83._20_4_ = auVar78._20_4_ * auVar86._20_4_;
  auVar83._24_4_ = auVar78._24_4_ * auVar86._24_4_;
  auVar83._28_4_ = auVar81._28_4_;
  auVar80 = vfmadd231ps_avx512vl(auVar79,auVar87,auVar80);
  auVar57 = vfmadd231ps_fma(auVar90,auVar87,auVar93);
  auVar56 = vfmadd231ps_fma(auVar83,auVar87,auVar85);
  auVar80 = vfmadd231ps_avx512vl(auVar80,auVar150,auVar82);
  auVar57 = vfmadd231ps_fma(ZEXT1632(auVar57),auVar150,auVar92);
  auVar56 = vfmadd231ps_fma(ZEXT1632(auVar56),auVar150,auVar84);
  auVar94._8_4_ = 0x7fffffff;
  auVar94._0_8_ = 0x7fffffff7fffffff;
  auVar94._12_4_ = 0x7fffffff;
  auVar94._16_4_ = 0x7fffffff;
  auVar94._20_4_ = 0x7fffffff;
  auVar94._24_4_ = 0x7fffffff;
  auVar94._28_4_ = 0x7fffffff;
  auVar82 = vandps_avx(ZEXT1632(auVar48),auVar94);
  auVar96._8_4_ = 0x219392ef;
  auVar96._0_8_ = 0x219392ef219392ef;
  auVar96._12_4_ = 0x219392ef;
  auVar96._16_4_ = 0x219392ef;
  auVar96._20_4_ = 0x219392ef;
  auVar96._24_4_ = 0x219392ef;
  auVar96._28_4_ = 0x219392ef;
  uVar42 = vcmpps_avx512vl(auVar82,auVar96,1);
  bVar46 = (bool)((byte)uVar42 & 1);
  auVar79._0_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * auVar48._0_4_;
  bVar46 = (bool)((byte)(uVar42 >> 1) & 1);
  auVar79._4_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * auVar48._4_4_;
  bVar46 = (bool)((byte)(uVar42 >> 2) & 1);
  auVar79._8_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * auVar48._8_4_;
  bVar46 = (bool)((byte)(uVar42 >> 3) & 1);
  auVar79._12_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * auVar48._12_4_;
  auVar79._16_4_ = (uint)((byte)(uVar42 >> 4) & 1) * 0x219392ef;
  auVar79._20_4_ = (uint)((byte)(uVar42 >> 5) & 1) * 0x219392ef;
  auVar79._24_4_ = (uint)((byte)(uVar42 >> 6) & 1) * 0x219392ef;
  auVar79._28_4_ = (uint)(byte)(uVar42 >> 7) * 0x219392ef;
  auVar82 = vandps_avx(ZEXT1632(auVar58),auVar94);
  uVar42 = vcmpps_avx512vl(auVar82,auVar96,1);
  bVar46 = (bool)((byte)uVar42 & 1);
  auVar76._0_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * auVar58._0_4_;
  bVar46 = (bool)((byte)(uVar42 >> 1) & 1);
  auVar76._4_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * auVar58._4_4_;
  bVar46 = (bool)((byte)(uVar42 >> 2) & 1);
  auVar76._8_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * auVar58._8_4_;
  bVar46 = (bool)((byte)(uVar42 >> 3) & 1);
  auVar76._12_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * auVar58._12_4_;
  auVar76._16_4_ = (uint)((byte)(uVar42 >> 4) & 1) * 0x219392ef;
  auVar76._20_4_ = (uint)((byte)(uVar42 >> 5) & 1) * 0x219392ef;
  auVar76._24_4_ = (uint)((byte)(uVar42 >> 6) & 1) * 0x219392ef;
  auVar76._28_4_ = (uint)(byte)(uVar42 >> 7) * 0x219392ef;
  auVar82 = vandps_avx(ZEXT1632(auVar4),auVar94);
  uVar42 = vcmpps_avx512vl(auVar82,auVar96,1);
  bVar46 = (bool)((byte)uVar42 & 1);
  auVar82._0_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * auVar4._0_4_;
  bVar46 = (bool)((byte)(uVar42 >> 1) & 1);
  auVar82._4_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * auVar4._4_4_;
  bVar46 = (bool)((byte)(uVar42 >> 2) & 1);
  auVar82._8_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * auVar4._8_4_;
  bVar46 = (bool)((byte)(uVar42 >> 3) & 1);
  auVar82._12_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * auVar4._12_4_;
  auVar82._16_4_ = (uint)((byte)(uVar42 >> 4) & 1) * 0x219392ef;
  auVar82._20_4_ = (uint)((byte)(uVar42 >> 5) & 1) * 0x219392ef;
  auVar82._24_4_ = (uint)((byte)(uVar42 >> 6) & 1) * 0x219392ef;
  auVar82._28_4_ = (uint)(byte)(uVar42 >> 7) * 0x219392ef;
  auVar81 = vrcp14ps_avx512vl(auVar79);
  auVar95._8_4_ = 0x3f800000;
  auVar95._0_8_ = 0x3f8000003f800000;
  auVar95._12_4_ = 0x3f800000;
  auVar95._16_4_ = 0x3f800000;
  auVar95._20_4_ = 0x3f800000;
  auVar95._24_4_ = 0x3f800000;
  auVar95._28_4_ = 0x3f800000;
  auVar48 = vfnmadd213ps_fma(auVar79,auVar81,auVar95);
  auVar48 = vfmadd132ps_fma(ZEXT1632(auVar48),auVar81,auVar81);
  auVar81 = vrcp14ps_avx512vl(auVar76);
  auVar58 = vfnmadd213ps_fma(auVar76,auVar81,auVar95);
  auVar58 = vfmadd132ps_fma(ZEXT1632(auVar58),auVar81,auVar81);
  auVar81 = vrcp14ps_avx512vl(auVar82);
  auVar4 = vfnmadd213ps_fma(auVar82,auVar81,auVar95);
  auVar4 = vfmadd132ps_fma(ZEXT1632(auVar4),auVar81,auVar81);
  auVar82 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar37 * 7 + 6));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx512vl(auVar82,auVar80);
  auVar84._4_4_ = auVar48._4_4_ * auVar82._4_4_;
  auVar84._0_4_ = auVar48._0_4_ * auVar82._0_4_;
  auVar84._8_4_ = auVar48._8_4_ * auVar82._8_4_;
  auVar84._12_4_ = auVar48._12_4_ * auVar82._12_4_;
  auVar84._16_4_ = auVar82._16_4_ * 0.0;
  auVar84._20_4_ = auVar82._20_4_ * 0.0;
  auVar84._24_4_ = auVar82._24_4_ * 0.0;
  auVar84._28_4_ = auVar82._28_4_;
  auVar82 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar37 * 9 + 6));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx512vl(auVar82,auVar80);
  auVar91._0_4_ = auVar48._0_4_ * auVar82._0_4_;
  auVar91._4_4_ = auVar48._4_4_ * auVar82._4_4_;
  auVar91._8_4_ = auVar48._8_4_ * auVar82._8_4_;
  auVar91._12_4_ = auVar48._12_4_ * auVar82._12_4_;
  auVar91._16_4_ = auVar82._16_4_ * 0.0;
  auVar91._20_4_ = auVar82._20_4_ * 0.0;
  auVar91._24_4_ = auVar82._24_4_ * 0.0;
  auVar91._28_4_ = 0;
  auVar82 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar37 * 0xe + 6));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,ZEXT1632(auVar57));
  auVar85._4_4_ = auVar58._4_4_ * auVar82._4_4_;
  auVar85._0_4_ = auVar58._0_4_ * auVar82._0_4_;
  auVar85._8_4_ = auVar58._8_4_ * auVar82._8_4_;
  auVar85._12_4_ = auVar58._12_4_ * auVar82._12_4_;
  auVar85._16_4_ = auVar82._16_4_ * 0.0;
  auVar85._20_4_ = auVar82._20_4_ * 0.0;
  auVar85._24_4_ = auVar82._24_4_ * 0.0;
  auVar85._28_4_ = auVar82._28_4_;
  auVar82 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,ZEXT1632(auVar57));
  auVar89._0_4_ = auVar58._0_4_ * auVar82._0_4_;
  auVar89._4_4_ = auVar58._4_4_ * auVar82._4_4_;
  auVar89._8_4_ = auVar58._8_4_ * auVar82._8_4_;
  auVar89._12_4_ = auVar58._12_4_ * auVar82._12_4_;
  auVar89._16_4_ = auVar82._16_4_ * 0.0;
  auVar89._20_4_ = auVar82._20_4_ * 0.0;
  auVar89._24_4_ = auVar82._24_4_ * 0.0;
  auVar89._28_4_ = 0;
  auVar82 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar37 * 0x15 + 6));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,ZEXT1632(auVar56));
  auVar86._4_4_ = auVar82._4_4_ * auVar4._4_4_;
  auVar86._0_4_ = auVar82._0_4_ * auVar4._0_4_;
  auVar86._8_4_ = auVar82._8_4_ * auVar4._8_4_;
  auVar86._12_4_ = auVar82._12_4_ * auVar4._12_4_;
  auVar86._16_4_ = auVar82._16_4_ * 0.0;
  auVar86._20_4_ = auVar82._20_4_ * 0.0;
  auVar86._24_4_ = auVar82._24_4_ * 0.0;
  auVar86._28_4_ = auVar82._28_4_;
  auVar82 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar37 * 0x17 + 6));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,ZEXT1632(auVar56));
  auVar77._0_4_ = auVar4._0_4_ * auVar82._0_4_;
  auVar77._4_4_ = auVar4._4_4_ * auVar82._4_4_;
  auVar77._8_4_ = auVar4._8_4_ * auVar82._8_4_;
  auVar77._12_4_ = auVar4._12_4_ * auVar82._12_4_;
  auVar77._16_4_ = auVar82._16_4_ * 0.0;
  auVar77._20_4_ = auVar82._20_4_ * 0.0;
  auVar77._24_4_ = auVar82._24_4_ * 0.0;
  auVar77._28_4_ = 0;
  auVar82 = vpminsd_avx2(auVar84,auVar91);
  auVar80 = vpminsd_avx2(auVar85,auVar89);
  auVar82 = vmaxps_avx(auVar82,auVar80);
  auVar80 = vpminsd_avx2(auVar86,auVar77);
  uVar117 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar81._4_4_ = uVar117;
  auVar81._0_4_ = uVar117;
  auVar81._8_4_ = uVar117;
  auVar81._12_4_ = uVar117;
  auVar81._16_4_ = uVar117;
  auVar81._20_4_ = uVar117;
  auVar81._24_4_ = uVar117;
  auVar81._28_4_ = uVar117;
  auVar80 = vmaxps_avx512vl(auVar80,auVar81);
  auVar82 = vmaxps_avx(auVar82,auVar80);
  auVar80._8_4_ = 0x3f7ffffa;
  auVar80._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar80._12_4_ = 0x3f7ffffa;
  auVar80._16_4_ = 0x3f7ffffa;
  auVar80._20_4_ = 0x3f7ffffa;
  auVar80._24_4_ = 0x3f7ffffa;
  auVar80._28_4_ = 0x3f7ffffa;
  local_1c0 = vmulps_avx512vl(auVar82,auVar80);
  auVar82 = vpmaxsd_avx2(auVar84,auVar91);
  auVar80 = vpmaxsd_avx2(auVar85,auVar89);
  auVar82 = vminps_avx(auVar82,auVar80);
  auVar80 = vpmaxsd_avx2(auVar86,auVar77);
  uVar117 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar92._4_4_ = uVar117;
  auVar92._0_4_ = uVar117;
  auVar92._8_4_ = uVar117;
  auVar92._12_4_ = uVar117;
  auVar92._16_4_ = uVar117;
  auVar92._20_4_ = uVar117;
  auVar92._24_4_ = uVar117;
  auVar92._28_4_ = uVar117;
  auVar80 = vminps_avx512vl(auVar80,auVar92);
  auVar82 = vminps_avx(auVar82,auVar80);
  auVar93._8_4_ = 0x3f800003;
  auVar93._0_8_ = 0x3f8000033f800003;
  auVar93._12_4_ = 0x3f800003;
  auVar93._16_4_ = 0x3f800003;
  auVar93._20_4_ = 0x3f800003;
  auVar93._24_4_ = 0x3f800003;
  auVar93._28_4_ = 0x3f800003;
  auVar82 = vmulps_avx512vl(auVar82,auVar93);
  auVar80 = vpbroadcastd_avx512vl();
  uVar16 = vcmpps_avx512vl(local_1c0,auVar82,2);
  uVar17 = vpcmpgtd_avx512vl(auVar80,_DAT_01fb4ba0);
  uVar42 = CONCAT44((int)((ulong)in_R10 >> 0x20),(uint)(byte)((byte)uVar16 & (byte)uVar17));
  local_220 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar242 = ZEXT1664(auVar48);
  auVar48 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar243 = ZEXT1664(auVar48);
  auVar48 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar244 = ZEXT1664(auVar48);
  auVar251 = ZEXT464(0x3f800000);
  auVar48 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
  auVar250 = ZEXT1664(auVar48);
LAB_019fb540:
  if (uVar42 == 0) {
    return;
  }
  lVar39 = 0;
  for (uVar37 = uVar42; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
    lVar39 = lVar39 + 1;
  }
  uVar6 = *(uint *)(prim + 2);
  uVar7 = *(uint *)(prim + lVar39 * 4 + 6);
  pGVar9 = (context->scene->geometries).items[uVar6].ptr;
  uVar37 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar7);
  p_Var10 = pGVar9[1].intersectionFilterN;
  pvVar11 = pGVar9[2].userPtr;
  _Var12 = pGVar9[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar48 = *(undefined1 (*) [16])(_Var12 + uVar37 * (long)pvVar11);
  auVar58 = *(undefined1 (*) [16])(_Var12 + (uVar37 + 1) * (long)pvVar11);
  auVar4 = *(undefined1 (*) [16])(_Var12 + (uVar37 + 2) * (long)pvVar11);
  auVar57 = *(undefined1 (*) [16])(_Var12 + (long)pvVar11 * (uVar37 + 3));
  lVar39 = *(long *)&pGVar9[1].time_range.upper;
  auVar56 = *(undefined1 (*) [16])(lVar39 + (long)p_Var10 * uVar37);
  auVar55 = *(undefined1 (*) [16])(lVar39 + (long)p_Var10 * (uVar37 + 1));
  auVar59 = *(undefined1 (*) [16])(lVar39 + (long)p_Var10 * (uVar37 + 2));
  uVar42 = uVar42 - 1 & uVar42;
  auVar54 = *(undefined1 (*) [16])(lVar39 + (long)p_Var10 * (uVar37 + 3));
  if (uVar42 != 0) {
    uVar43 = uVar42 - 1 & uVar42;
    for (uVar37 = uVar42; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
    }
    if (uVar43 != 0) {
      for (; (uVar43 & 1) == 0; uVar43 = uVar43 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar5 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c
                        );
  auVar5 = vinsertps_avx(auVar5,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar1 = *(float *)(ray + k * 4 + 0x60);
  auVar118 = ZEXT816(0) << 0x40;
  auVar52._0_4_ = auVar54._0_4_ * 0.0;
  auVar52._4_4_ = auVar54._4_4_ * 0.0;
  auVar52._8_4_ = auVar54._8_4_ * 0.0;
  auVar52._12_4_ = auVar54._12_4_ * 0.0;
  auVar231._8_4_ = 0x3e2aaaab;
  auVar231._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar231._12_4_ = 0x3e2aaaab;
  auVar50 = vfmadd213ps_fma(auVar231,auVar59,auVar52);
  auVar49 = vbroadcastss_avx512vl(ZEXT416(0x3f2aaaab));
  auVar50 = vfmadd231ps_avx512vl(auVar50,auVar55,auVar49);
  auVar60 = vfmadd231ps_fma(auVar50,auVar56,auVar231);
  auVar120 = auVar242._0_16_;
  auVar50 = vfmadd231ps_avx512vl(auVar52,auVar59,auVar120);
  auVar50 = vfnmadd231ps_fma(auVar50,auVar55,auVar118);
  auVar51 = vfnmadd231ps_avx512vl(auVar50,auVar56,auVar120);
  auVar211._0_4_ = auVar57._0_4_ * 0.0;
  auVar211._4_4_ = auVar57._4_4_ * 0.0;
  auVar211._8_4_ = auVar57._8_4_ * 0.0;
  auVar211._12_4_ = auVar57._12_4_ * 0.0;
  auVar50 = vfmadd213ps_fma(auVar231,auVar4,auVar211);
  auVar50 = vfmadd231ps_avx512vl(auVar50,auVar58,auVar49);
  auVar50 = vfmadd231ps_fma(auVar50,auVar48,auVar231);
  auVar52 = vfmadd231ps_avx512vl(auVar211,auVar4,auVar120);
  auVar52 = vfnmadd231ps_fma(auVar52,auVar58,auVar118);
  auVar53 = vfnmadd231ps_avx512vl(auVar52,auVar48,auVar120);
  auVar63._0_4_ = auVar54._0_4_ * 0.16666667;
  auVar63._4_4_ = auVar54._4_4_ * 0.16666667;
  auVar63._8_4_ = auVar54._8_4_ * 0.16666667;
  auVar63._12_4_ = auVar54._12_4_ * 0.16666667;
  auVar52 = vfmadd231ps_avx512vl(auVar63,auVar59,auVar49);
  auVar52 = vfmadd231ps_fma(auVar52,auVar55,auVar231);
  auVar52 = vfmadd231ps_fma(auVar52,auVar56,auVar118);
  auVar54 = vmulps_avx512vl(auVar54,auVar120);
  auVar59 = vfmadd231ps_fma(auVar54,auVar118,auVar59);
  auVar55 = vfnmadd231ps_avx512vl(auVar59,auVar120,auVar55);
  auVar59 = vfnmadd231ps_fma(auVar55,auVar118,auVar56);
  auVar180._0_4_ = auVar57._0_4_ * 0.16666667;
  auVar180._4_4_ = auVar57._4_4_ * 0.16666667;
  auVar180._8_4_ = auVar57._8_4_ * 0.16666667;
  auVar180._12_4_ = auVar57._12_4_ * 0.16666667;
  auVar56 = vfmadd231ps_avx512vl(auVar180,auVar4,auVar49);
  auVar56 = vfmadd231ps_fma(auVar56,auVar58,auVar231);
  auVar56 = vfmadd231ps_fma(auVar56,auVar48,auVar118);
  auVar57 = vmulps_avx512vl(auVar57,auVar120);
  auVar4 = vfmadd231ps_fma(auVar57,auVar118,auVar4);
  auVar58 = vfnmadd231ps_avx512vl(auVar4,auVar120,auVar58);
  auVar55 = vfnmadd231ps_fma(auVar58,auVar118,auVar48);
  auVar48 = vshufps_avx(auVar51,auVar51,0xc9);
  auVar58 = vshufps_avx(auVar50,auVar50,0xc9);
  fVar114 = auVar51._0_4_;
  auVar69._0_4_ = fVar114 * auVar58._0_4_;
  fVar115 = auVar51._4_4_;
  auVar69._4_4_ = fVar115 * auVar58._4_4_;
  fVar116 = auVar51._8_4_;
  auVar69._8_4_ = fVar116 * auVar58._8_4_;
  fVar126 = auVar51._12_4_;
  auVar69._12_4_ = fVar126 * auVar58._12_4_;
  auVar58 = vfmsub231ps_fma(auVar69,auVar48,auVar50);
  auVar4 = vshufps_avx(auVar58,auVar58,0xc9);
  auVar58 = vshufps_avx(auVar53,auVar53,0xc9);
  auVar153._0_4_ = fVar114 * auVar58._0_4_;
  auVar153._4_4_ = fVar115 * auVar58._4_4_;
  auVar153._8_4_ = fVar116 * auVar58._8_4_;
  auVar153._12_4_ = fVar126 * auVar58._12_4_;
  auVar48 = vfmsub231ps_fma(auVar153,auVar48,auVar53);
  auVar57 = vshufps_avx(auVar48,auVar48,0xc9);
  auVar48 = vshufps_avx(auVar59,auVar59,0xc9);
  auVar58 = vshufps_avx(auVar56,auVar56,0xc9);
  fVar134 = auVar59._0_4_;
  auVar70._0_4_ = fVar134 * auVar58._0_4_;
  fVar141 = auVar59._4_4_;
  auVar70._4_4_ = fVar141 * auVar58._4_4_;
  fVar142 = auVar59._8_4_;
  auVar70._8_4_ = fVar142 * auVar58._8_4_;
  fVar143 = auVar59._12_4_;
  auVar70._12_4_ = fVar143 * auVar58._12_4_;
  auVar58 = vfmsub231ps_fma(auVar70,auVar48,auVar56);
  auVar56 = vshufps_avx(auVar58,auVar58,0xc9);
  auVar58 = vshufps_avx(auVar55,auVar55,0xc9);
  auVar181._0_4_ = auVar58._0_4_ * fVar134;
  auVar181._4_4_ = auVar58._4_4_ * fVar141;
  auVar181._8_4_ = auVar58._8_4_ * fVar142;
  auVar181._12_4_ = auVar58._12_4_ * fVar143;
  auVar58 = vfmsub231ps_fma(auVar181,auVar48,auVar55);
  auVar48 = vdpps_avx(auVar4,auVar4,0x7f);
  auVar55 = vshufps_avx(auVar58,auVar58,0xc9);
  fVar199 = auVar48._0_4_;
  auVar182._4_12_ = ZEXT812(0) << 0x20;
  auVar182._0_4_ = fVar199;
  auVar58 = vrsqrt14ss_avx512f(auVar118,auVar182);
  auVar54 = vmulss_avx512f(auVar58,ZEXT416(0x3fc00000));
  auVar50 = vmulss_avx512f(auVar48,ZEXT416(0xbf000000));
  fVar109 = auVar58._0_4_;
  auVar58 = vdpps_avx(auVar4,auVar57,0x7f);
  fVar109 = auVar54._0_4_ + auVar50._0_4_ * fVar109 * fVar109 * fVar109;
  fVar210 = fVar109 * auVar4._0_4_;
  fVar221 = fVar109 * auVar4._4_4_;
  fVar222 = fVar109 * auVar4._8_4_;
  fVar223 = fVar109 * auVar4._12_4_;
  auVar192._0_4_ = auVar57._0_4_ * fVar199;
  auVar192._4_4_ = auVar57._4_4_ * fVar199;
  auVar192._8_4_ = auVar57._8_4_ * fVar199;
  auVar192._12_4_ = auVar57._12_4_ * fVar199;
  fVar199 = auVar58._0_4_;
  auVar160._0_4_ = fVar199 * auVar4._0_4_;
  auVar160._4_4_ = fVar199 * auVar4._4_4_;
  auVar160._8_4_ = fVar199 * auVar4._8_4_;
  auVar160._12_4_ = fVar199 * auVar4._12_4_;
  auVar4 = vsubps_avx(auVar192,auVar160);
  auVar58 = vrcp14ss_avx512f(auVar118,auVar182);
  auVar48 = vfnmadd213ss_avx512f(auVar48,auVar58,ZEXT416(0x40000000));
  fVar208 = auVar58._0_4_ * auVar48._0_4_;
  auVar48 = vdpps_avx(auVar56,auVar56,0x7f);
  fVar209 = auVar48._0_4_;
  auVar183._4_12_ = ZEXT812(0) << 0x20;
  auVar183._0_4_ = fVar209;
  auVar58 = vrsqrt14ss_avx512f(auVar118,auVar183);
  auVar57 = vmulss_avx512f(auVar58,ZEXT416(0x3fc00000));
  auVar54 = vmulss_avx512f(auVar48,ZEXT416(0xbf000000));
  fVar199 = auVar58._0_4_;
  fVar199 = auVar57._0_4_ + auVar54._0_4_ * fVar199 * fVar199 * fVar199;
  auVar58 = vdpps_avx(auVar56,auVar55,0x7f);
  fVar224 = fVar199 * auVar56._0_4_;
  fVar228 = fVar199 * auVar56._4_4_;
  fVar229 = fVar199 * auVar56._8_4_;
  fVar230 = fVar199 * auVar56._12_4_;
  auVar64._0_4_ = fVar209 * auVar55._0_4_;
  auVar64._4_4_ = fVar209 * auVar55._4_4_;
  auVar64._8_4_ = fVar209 * auVar55._8_4_;
  auVar64._12_4_ = fVar209 * auVar55._12_4_;
  fVar209 = auVar58._0_4_;
  auVar68._0_4_ = fVar209 * auVar56._0_4_;
  auVar68._4_4_ = fVar209 * auVar56._4_4_;
  auVar68._8_4_ = fVar209 * auVar56._8_4_;
  auVar68._12_4_ = fVar209 * auVar56._12_4_;
  auVar57 = vsubps_avx(auVar64,auVar68);
  auVar58 = vrcp14ss_avx512f(auVar118,auVar183);
  auVar48 = vfnmadd213ss_avx512f(auVar48,auVar58,ZEXT416(0x40000000));
  fVar209 = auVar48._0_4_ * auVar58._0_4_;
  auVar48 = vshufps_avx(auVar60,auVar60,0xff);
  auVar167._0_4_ = fVar210 * auVar48._0_4_;
  auVar167._4_4_ = fVar221 * auVar48._4_4_;
  auVar167._8_4_ = fVar222 * auVar48._8_4_;
  auVar167._12_4_ = fVar223 * auVar48._12_4_;
  local_340 = vsubps_avx(auVar60,auVar167);
  auVar58 = vshufps_avx(auVar51,auVar51,0xff);
  auVar65._0_4_ = auVar58._0_4_ * fVar210 + auVar48._0_4_ * fVar109 * fVar208 * auVar4._0_4_;
  auVar65._4_4_ = auVar58._4_4_ * fVar221 + auVar48._4_4_ * fVar109 * fVar208 * auVar4._4_4_;
  auVar65._8_4_ = auVar58._8_4_ * fVar222 + auVar48._8_4_ * fVar109 * fVar208 * auVar4._8_4_;
  auVar65._12_4_ = auVar58._12_4_ * fVar223 + auVar48._12_4_ * fVar109 * fVar208 * auVar4._12_4_;
  auVar4 = vsubps_avx(auVar51,auVar65);
  local_350._0_4_ = auVar167._0_4_ + auVar60._0_4_;
  local_350._4_4_ = auVar167._4_4_ + auVar60._4_4_;
  fStack_348 = auVar167._8_4_ + auVar60._8_4_;
  fStack_344 = auVar167._12_4_ + auVar60._12_4_;
  auVar48 = vshufps_avx(auVar52,auVar52,0xff);
  auVar71._0_4_ = fVar224 * auVar48._0_4_;
  auVar71._4_4_ = fVar228 * auVar48._4_4_;
  auVar71._8_4_ = fVar229 * auVar48._8_4_;
  auVar71._12_4_ = fVar230 * auVar48._12_4_;
  local_360 = vsubps_avx512vl(auVar52,auVar71);
  auVar58 = vshufps_avx(auVar59,auVar59,0xff);
  auVar120._0_4_ = auVar58._0_4_ * fVar224 + auVar48._0_4_ * fVar199 * auVar57._0_4_ * fVar209;
  auVar120._4_4_ = auVar58._4_4_ * fVar228 + auVar48._4_4_ * fVar199 * auVar57._4_4_ * fVar209;
  auVar120._8_4_ = auVar58._8_4_ * fVar229 + auVar48._8_4_ * fVar199 * auVar57._8_4_ * fVar209;
  auVar120._12_4_ = auVar58._12_4_ * fVar230 + auVar48._12_4_ * fVar199 * auVar57._12_4_ * fVar209;
  auVar48 = vsubps_avx(auVar59,auVar120);
  local_370._0_4_ = auVar52._0_4_ + auVar71._0_4_;
  local_370._4_4_ = auVar52._4_4_ + auVar71._4_4_;
  fStack_368 = auVar52._8_4_ + auVar71._8_4_;
  fStack_364 = auVar52._12_4_ + auVar71._12_4_;
  auVar72._0_4_ = auVar4._0_4_ * 0.33333334;
  auVar72._4_4_ = auVar4._4_4_ * 0.33333334;
  auVar72._8_4_ = auVar4._8_4_ * 0.33333334;
  auVar72._12_4_ = auVar4._12_4_ * 0.33333334;
  local_380 = vaddps_avx512vl(local_340,auVar72);
  auVar75._0_4_ = auVar48._0_4_ * 0.33333334;
  auVar75._4_4_ = auVar48._4_4_ * 0.33333334;
  auVar75._8_4_ = auVar48._8_4_ * 0.33333334;
  auVar75._12_4_ = auVar48._12_4_ * 0.33333334;
  local_390 = vsubps_avx512vl(local_360,auVar75);
  auVar60._0_4_ = (fVar114 + auVar65._0_4_) * 0.33333334;
  auVar60._4_4_ = (fVar115 + auVar65._4_4_) * 0.33333334;
  auVar60._8_4_ = (fVar116 + auVar65._8_4_) * 0.33333334;
  auVar60._12_4_ = (fVar126 + auVar65._12_4_) * 0.33333334;
  _local_3a0 = vaddps_avx512vl(_local_350,auVar60);
  auVar49._0_4_ = (fVar134 + auVar120._0_4_) * 0.33333334;
  auVar49._4_4_ = (fVar141 + auVar120._4_4_) * 0.33333334;
  auVar49._8_4_ = (fVar142 + auVar120._8_4_) * 0.33333334;
  auVar49._12_4_ = (fVar143 + auVar120._12_4_) * 0.33333334;
  _local_3b0 = vsubps_avx512vl(_local_370,auVar49);
  local_2c0 = vsubps_avx(local_340,auVar5);
  uVar117 = local_2c0._0_4_;
  auVar61._4_4_ = uVar117;
  auVar61._0_4_ = uVar117;
  auVar61._8_4_ = uVar117;
  auVar61._12_4_ = uVar117;
  auVar48 = vshufps_avx(local_2c0,local_2c0,0x55);
  aVar2 = pre->ray_space[k].vx.field_0;
  aVar3 = pre->ray_space[k].vy.field_0;
  auVar58 = vshufps_avx(local_2c0,local_2c0,0xaa);
  fVar109 = pre->ray_space[k].vz.field_0.m128[0];
  fVar199 = pre->ray_space[k].vz.field_0.m128[1];
  fVar208 = pre->ray_space[k].vz.field_0.m128[2];
  fVar209 = pre->ray_space[k].vz.field_0.m128[3];
  auVar51._0_4_ = fVar109 * auVar58._0_4_;
  auVar51._4_4_ = fVar199 * auVar58._4_4_;
  auVar51._8_4_ = fVar208 * auVar58._8_4_;
  auVar51._12_4_ = fVar209 * auVar58._12_4_;
  auVar48 = vfmadd231ps_fma(auVar51,(undefined1  [16])aVar3,auVar48);
  auVar59 = vfmadd231ps_fma(auVar48,(undefined1  [16])aVar2,auVar61);
  local_2d0 = vsubps_avx512vl(local_380,auVar5);
  uVar117 = local_2d0._0_4_;
  auVar66._4_4_ = uVar117;
  auVar66._0_4_ = uVar117;
  auVar66._8_4_ = uVar117;
  auVar66._12_4_ = uVar117;
  auVar48 = vshufps_avx(local_2d0,local_2d0,0x55);
  auVar58 = vshufps_avx(local_2d0,local_2d0,0xaa);
  auVar62._0_4_ = fVar109 * auVar58._0_4_;
  auVar62._4_4_ = fVar199 * auVar58._4_4_;
  auVar62._8_4_ = fVar208 * auVar58._8_4_;
  auVar62._12_4_ = fVar209 * auVar58._12_4_;
  auVar48 = vfmadd231ps_fma(auVar62,(undefined1  [16])aVar3,auVar48);
  auVar54 = vfmadd231ps_fma(auVar48,(undefined1  [16])aVar2,auVar66);
  local_2e0 = vsubps_avx512vl(local_390,auVar5);
  uVar117 = local_2e0._0_4_;
  auVar73._4_4_ = uVar117;
  auVar73._0_4_ = uVar117;
  auVar73._8_4_ = uVar117;
  auVar73._12_4_ = uVar117;
  auVar48 = vshufps_avx(local_2e0,local_2e0,0x55);
  auVar58 = vshufps_avx(local_2e0,local_2e0,0xaa);
  auVar67._0_4_ = fVar109 * auVar58._0_4_;
  auVar67._4_4_ = fVar199 * auVar58._4_4_;
  auVar67._8_4_ = fVar208 * auVar58._8_4_;
  auVar67._12_4_ = fVar209 * auVar58._12_4_;
  auVar48 = vfmadd231ps_fma(auVar67,(undefined1  [16])aVar3,auVar48);
  auVar50 = vfmadd231ps_fma(auVar48,(undefined1  [16])aVar2,auVar73);
  local_2f0 = vsubps_avx512vl(local_360,auVar5);
  uVar117 = local_2f0._0_4_;
  auVar168._4_4_ = uVar117;
  auVar168._0_4_ = uVar117;
  auVar168._8_4_ = uVar117;
  auVar168._12_4_ = uVar117;
  auVar48 = vshufps_avx(local_2f0,local_2f0,0x55);
  auVar58 = vshufps_avx(local_2f0,local_2f0,0xaa);
  auVar74._0_4_ = fVar109 * auVar58._0_4_;
  auVar74._4_4_ = fVar199 * auVar58._4_4_;
  auVar74._8_4_ = fVar208 * auVar58._8_4_;
  auVar74._12_4_ = fVar209 * auVar58._12_4_;
  auVar48 = vfmadd231ps_fma(auVar74,(undefined1  [16])aVar3,auVar48);
  auVar60 = vfmadd231ps_fma(auVar48,(undefined1  [16])aVar2,auVar168);
  local_300 = vsubps_avx(_local_350,auVar5);
  uVar117 = local_300._0_4_;
  auVar169._4_4_ = uVar117;
  auVar169._0_4_ = uVar117;
  auVar169._8_4_ = uVar117;
  auVar169._12_4_ = uVar117;
  auVar48 = vshufps_avx(local_300,local_300,0x55);
  auVar58 = vshufps_avx(local_300,local_300,0xaa);
  auVar193._0_4_ = auVar58._0_4_ * fVar109;
  auVar193._4_4_ = auVar58._4_4_ * fVar199;
  auVar193._8_4_ = auVar58._8_4_ * fVar208;
  auVar193._12_4_ = auVar58._12_4_ * fVar209;
  auVar48 = vfmadd231ps_fma(auVar193,(undefined1  [16])aVar3,auVar48);
  auVar52 = vfmadd231ps_fma(auVar48,(undefined1  [16])aVar2,auVar169);
  local_310 = vsubps_avx512vl(_local_3a0,auVar5);
  uVar117 = local_310._0_4_;
  auVar170._4_4_ = uVar117;
  auVar170._0_4_ = uVar117;
  auVar170._8_4_ = uVar117;
  auVar170._12_4_ = uVar117;
  auVar48 = vshufps_avx(local_310,local_310,0x55);
  auVar58 = vshufps_avx(local_310,local_310,0xaa);
  auVar200._0_4_ = auVar58._0_4_ * fVar109;
  auVar200._4_4_ = auVar58._4_4_ * fVar199;
  auVar200._8_4_ = auVar58._8_4_ * fVar208;
  auVar200._12_4_ = auVar58._12_4_ * fVar209;
  auVar48 = vfmadd231ps_fma(auVar200,(undefined1  [16])aVar3,auVar48);
  auVar49 = vfmadd231ps_fma(auVar48,(undefined1  [16])aVar2,auVar170);
  local_320 = vsubps_avx512vl(_local_3b0,auVar5);
  uVar117 = local_320._0_4_;
  auVar171._4_4_ = uVar117;
  auVar171._0_4_ = uVar117;
  auVar171._8_4_ = uVar117;
  auVar171._12_4_ = uVar117;
  auVar48 = vshufps_avx(local_320,local_320,0x55);
  auVar58 = vshufps_avx(local_320,local_320,0xaa);
  auVar212._0_4_ = auVar58._0_4_ * fVar109;
  auVar212._4_4_ = auVar58._4_4_ * fVar199;
  auVar212._8_4_ = auVar58._8_4_ * fVar208;
  auVar212._12_4_ = auVar58._12_4_ * fVar209;
  auVar48 = vfmadd231ps_fma(auVar212,(undefined1  [16])aVar3,auVar48);
  auVar51 = vfmadd231ps_fma(auVar48,(undefined1  [16])aVar2,auVar171);
  local_330 = vsubps_avx(_local_370,auVar5);
  uVar117 = local_330._0_4_;
  auVar53._4_4_ = uVar117;
  auVar53._0_4_ = uVar117;
  auVar53._8_4_ = uVar117;
  auVar53._12_4_ = uVar117;
  auVar48 = vshufps_avx(local_330,local_330,0x55);
  auVar58 = vshufps_avx(local_330,local_330,0xaa);
  auVar161._0_4_ = auVar58._0_4_ * fVar109;
  auVar161._4_4_ = auVar58._4_4_ * fVar199;
  auVar161._8_4_ = auVar58._8_4_ * fVar208;
  auVar161._12_4_ = auVar58._12_4_ * fVar209;
  auVar48 = vfmadd231ps_fma(auVar161,(undefined1  [16])aVar3,auVar48);
  auVar5 = vfmadd231ps_fma(auVar48,(undefined1  [16])aVar2,auVar53);
  auVar4 = vmovlhps_avx(auVar59,auVar52);
  auVar57 = vmovlhps_avx(auVar54,auVar49);
  auVar55 = vmovlhps_avx512f(auVar50,auVar51);
  _local_2a0 = vmovlhps_avx512f(auVar60,auVar5);
  auVar58 = vminps_avx(auVar4,auVar57);
  auVar48 = vmaxps_avx(auVar4,auVar57);
  auVar56 = vminps_avx512vl(auVar55,_local_2a0);
  auVar58 = vminps_avx(auVar58,auVar56);
  auVar56 = vmaxps_avx512vl(auVar55,_local_2a0);
  auVar48 = vmaxps_avx(auVar48,auVar56);
  auVar56 = vshufpd_avx(auVar58,auVar58,3);
  auVar58 = vminps_avx(auVar58,auVar56);
  auVar56 = vshufpd_avx(auVar48,auVar48,3);
  auVar48 = vmaxps_avx(auVar48,auVar56);
  auVar58 = vandps_avx512vl(auVar58,auVar243._0_16_);
  auVar48 = vandps_avx512vl(auVar48,auVar243._0_16_);
  auVar48 = vmaxps_avx(auVar58,auVar48);
  auVar58 = vmovshdup_avx(auVar48);
  auVar48 = vmaxss_avx(auVar58,auVar48);
  auVar56 = vmovddup_avx512vl(auVar59);
  auVar59 = vmovddup_avx512vl(auVar54);
  auVar54 = vmovddup_avx512vl(auVar50);
  auVar118._8_8_ = auVar60._0_8_;
  auVar118._0_8_ = auVar60._0_8_;
  local_2b0 = ZEXT416((uint)(auVar48._0_4_ * 9.536743e-07));
  local_260 = vbroadcastss_avx512vl(local_2b0);
  auVar48 = vxorps_avx512vl(local_260._0_16_,auVar244._0_16_);
  local_280 = vbroadcastss_avx512vl(auVar48);
  uVar37 = 0;
  auVar48 = vsubps_avx(auVar57,auVar4);
  auVar60 = vsubps_avx512vl(auVar55,auVar57);
  local_290 = vsubps_avx512vl(_local_2a0,auVar55);
  local_3c0 = vsubps_avx(_local_350,local_340);
  local_3d0 = vsubps_avx512vl(_local_3a0,local_380);
  local_3e0 = vsubps_avx512vl(_local_3b0,local_390);
  _local_3f0 = vsubps_avx512vl(_local_370,local_360);
  local_1e0 = vpbroadcastd_avx512vl();
  local_200 = vpbroadcastd_avx512vl();
  auVar58 = ZEXT816(0x3f80000000000000);
  auVar50 = auVar58;
LAB_019fbcb8:
  do {
    auVar53 = vshufps_avx(auVar50,auVar50,0x50);
    auVar232._8_4_ = 0x3f800000;
    auVar232._0_8_ = 0x3f8000003f800000;
    auVar232._12_4_ = 0x3f800000;
    auVar235._16_4_ = 0x3f800000;
    auVar235._0_16_ = auVar232;
    auVar235._20_4_ = 0x3f800000;
    auVar235._24_4_ = 0x3f800000;
    auVar235._28_4_ = 0x3f800000;
    auVar120 = vsubps_avx(auVar232,auVar53);
    fVar109 = auVar53._0_4_;
    fVar114 = auVar52._0_4_;
    auVar135._0_4_ = fVar114 * fVar109;
    fVar199 = auVar53._4_4_;
    fVar115 = auVar52._4_4_;
    auVar135._4_4_ = fVar115 * fVar199;
    fVar208 = auVar53._8_4_;
    auVar135._8_4_ = fVar114 * fVar208;
    fVar209 = auVar53._12_4_;
    auVar135._12_4_ = fVar115 * fVar209;
    fVar116 = auVar49._0_4_;
    auVar144._0_4_ = fVar116 * fVar109;
    fVar126 = auVar49._4_4_;
    auVar144._4_4_ = fVar126 * fVar199;
    auVar144._8_4_ = fVar116 * fVar208;
    auVar144._12_4_ = fVar126 * fVar209;
    fVar134 = auVar51._0_4_;
    auVar154._0_4_ = fVar134 * fVar109;
    fVar141 = auVar51._4_4_;
    auVar154._4_4_ = fVar141 * fVar199;
    auVar154._8_4_ = fVar134 * fVar208;
    auVar154._12_4_ = fVar141 * fVar209;
    fVar142 = auVar5._0_4_;
    auVar121._0_4_ = fVar142 * fVar109;
    fVar143 = auVar5._4_4_;
    auVar121._4_4_ = fVar143 * fVar199;
    auVar121._8_4_ = fVar142 * fVar208;
    auVar121._12_4_ = fVar143 * fVar209;
    auVar61 = vfmadd231ps_avx512vl(auVar135,auVar120,auVar56);
    auVar62 = vfmadd231ps_avx512vl(auVar144,auVar120,auVar59);
    auVar63 = vfmadd231ps_avx512vl(auVar154,auVar120,auVar54);
    auVar120 = vfmadd231ps_fma(auVar121,auVar118,auVar120);
    auVar53 = vmovshdup_avx(auVar58);
    fVar199 = auVar58._0_4_;
    fVar109 = (auVar53._0_4_ - fVar199) * 0.04761905;
    auVar179._4_4_ = fVar199;
    auVar179._0_4_ = fVar199;
    auVar179._8_4_ = fVar199;
    auVar179._12_4_ = fVar199;
    auVar179._16_4_ = fVar199;
    auVar179._20_4_ = fVar199;
    auVar179._24_4_ = fVar199;
    auVar179._28_4_ = fVar199;
    auVar132._0_8_ = auVar53._0_8_;
    auVar132._8_8_ = auVar132._0_8_;
    auVar132._16_8_ = auVar132._0_8_;
    auVar132._24_8_ = auVar132._0_8_;
    auVar82 = vsubps_avx(auVar132,auVar179);
    uVar117 = auVar61._0_4_;
    auVar133._4_4_ = uVar117;
    auVar133._0_4_ = uVar117;
    auVar133._8_4_ = uVar117;
    auVar133._12_4_ = uVar117;
    auVar133._16_4_ = uVar117;
    auVar133._20_4_ = uVar117;
    auVar133._24_4_ = uVar117;
    auVar133._28_4_ = uVar117;
    auVar196._8_4_ = 1;
    auVar196._0_8_ = 0x100000001;
    auVar196._12_4_ = 1;
    auVar196._16_4_ = 1;
    auVar196._20_4_ = 1;
    auVar196._24_4_ = 1;
    auVar196._28_4_ = 1;
    auVar92 = ZEXT1632(auVar61);
    auVar80 = vpermps_avx2(auVar196,auVar92);
    auVar81 = vbroadcastss_avx512vl(auVar62);
    auVar93 = ZEXT1632(auVar62);
    auVar83 = vpermps_avx512vl(auVar196,auVar93);
    auVar84 = vbroadcastss_avx512vl(auVar63);
    auVar77 = ZEXT1632(auVar63);
    auVar85 = vpermps_avx512vl(auVar196,auVar77);
    auVar86 = vbroadcastss_avx512vl(auVar120);
    auVar89 = ZEXT1632(auVar120);
    auVar87 = vpermps_avx512vl(auVar196,auVar89);
    auVar197._4_4_ = fVar109;
    auVar197._0_4_ = fVar109;
    auVar197._8_4_ = fVar109;
    auVar197._12_4_ = fVar109;
    auVar197._16_4_ = fVar109;
    auVar197._20_4_ = fVar109;
    auVar197._24_4_ = fVar109;
    auVar197._28_4_ = fVar109;
    auVar90 = auVar249._0_32_;
    auVar78 = vpermps_avx512vl(auVar90,auVar92);
    auVar166._8_4_ = 3;
    auVar166._0_8_ = 0x300000003;
    auVar166._12_4_ = 3;
    auVar166._16_4_ = 3;
    auVar166._20_4_ = 3;
    auVar166._24_4_ = 3;
    auVar166._28_4_ = 3;
    auVar79 = vpermps_avx512vl(auVar166,auVar92);
    auVar88 = vpermps_avx512vl(auVar90,auVar93);
    auVar92 = vpermps_avx2(auVar166,auVar93);
    auVar76 = vpermps_avx512vl(auVar90,auVar77);
    auVar93 = vpermps_avx2(auVar166,auVar77);
    auVar77 = vpermps_avx512vl(auVar90,auVar89);
    auVar89 = vpermps_avx512vl(auVar166,auVar89);
    auVar53 = vfmadd132ps_fma(auVar82,auVar179,_DAT_01f7b040);
    auVar82 = vsubps_avx(auVar235,ZEXT1632(auVar53));
    auVar90 = vmulps_avx512vl(auVar81,ZEXT1632(auVar53));
    auVar94 = ZEXT1632(auVar53);
    auVar91 = vmulps_avx512vl(auVar83,auVar94);
    auVar120 = vfmadd231ps_fma(auVar90,auVar82,auVar133);
    auVar61 = vfmadd231ps_fma(auVar91,auVar82,auVar80);
    auVar90 = vmulps_avx512vl(auVar84,auVar94);
    auVar91 = vmulps_avx512vl(auVar85,auVar94);
    auVar81 = vfmadd231ps_avx512vl(auVar90,auVar82,auVar81);
    auVar83 = vfmadd231ps_avx512vl(auVar91,auVar82,auVar83);
    auVar90 = vmulps_avx512vl(auVar86,auVar94);
    auVar91 = ZEXT1632(auVar53);
    auVar87 = vmulps_avx512vl(auVar87,auVar91);
    auVar84 = vfmadd231ps_avx512vl(auVar90,auVar82,auVar84);
    auVar85 = vfmadd231ps_avx512vl(auVar87,auVar82,auVar85);
    fVar208 = auVar53._0_4_;
    fVar209 = auVar53._4_4_;
    auVar22._4_4_ = fVar209 * auVar81._4_4_;
    auVar22._0_4_ = fVar208 * auVar81._0_4_;
    fVar210 = auVar53._8_4_;
    auVar22._8_4_ = fVar210 * auVar81._8_4_;
    fVar221 = auVar53._12_4_;
    auVar22._12_4_ = fVar221 * auVar81._12_4_;
    auVar22._16_4_ = auVar81._16_4_ * 0.0;
    auVar22._20_4_ = auVar81._20_4_ * 0.0;
    auVar22._24_4_ = auVar81._24_4_ * 0.0;
    auVar22._28_4_ = fVar199;
    auVar23._4_4_ = fVar209 * auVar83._4_4_;
    auVar23._0_4_ = fVar208 * auVar83._0_4_;
    auVar23._8_4_ = fVar210 * auVar83._8_4_;
    auVar23._12_4_ = fVar221 * auVar83._12_4_;
    auVar23._16_4_ = auVar83._16_4_ * 0.0;
    auVar23._20_4_ = auVar83._20_4_ * 0.0;
    auVar23._24_4_ = auVar83._24_4_ * 0.0;
    auVar23._28_4_ = auVar80._28_4_;
    auVar120 = vfmadd231ps_fma(auVar22,auVar82,ZEXT1632(auVar120));
    auVar61 = vfmadd231ps_fma(auVar23,auVar82,ZEXT1632(auVar61));
    auVar124._0_4_ = fVar208 * auVar84._0_4_;
    auVar124._4_4_ = fVar209 * auVar84._4_4_;
    auVar124._8_4_ = fVar210 * auVar84._8_4_;
    auVar124._12_4_ = fVar221 * auVar84._12_4_;
    auVar124._16_4_ = auVar84._16_4_ * 0.0;
    auVar124._20_4_ = auVar84._20_4_ * 0.0;
    auVar124._24_4_ = auVar84._24_4_ * 0.0;
    auVar124._28_4_ = 0;
    auVar24._4_4_ = fVar209 * auVar85._4_4_;
    auVar24._0_4_ = fVar208 * auVar85._0_4_;
    auVar24._8_4_ = fVar210 * auVar85._8_4_;
    auVar24._12_4_ = fVar221 * auVar85._12_4_;
    auVar24._16_4_ = auVar85._16_4_ * 0.0;
    auVar24._20_4_ = auVar85._20_4_ * 0.0;
    auVar24._24_4_ = auVar85._24_4_ * 0.0;
    auVar24._28_4_ = auVar84._28_4_;
    auVar62 = vfmadd231ps_fma(auVar124,auVar82,auVar81);
    auVar63 = vfmadd231ps_fma(auVar24,auVar82,auVar83);
    auVar25._28_4_ = auVar83._28_4_;
    auVar25._0_28_ =
         ZEXT1628(CONCAT412(fVar221 * auVar63._12_4_,
                            CONCAT48(fVar210 * auVar63._8_4_,
                                     CONCAT44(fVar209 * auVar63._4_4_,fVar208 * auVar63._0_4_))));
    auVar72 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar221 * auVar62._12_4_,
                                                 CONCAT48(fVar210 * auVar62._8_4_,
                                                          CONCAT44(fVar209 * auVar62._4_4_,
                                                                   fVar208 * auVar62._0_4_)))),
                              auVar82,ZEXT1632(auVar120));
    auVar75 = vfmadd231ps_fma(auVar25,auVar82,ZEXT1632(auVar61));
    auVar80 = vsubps_avx(ZEXT1632(auVar62),ZEXT1632(auVar120));
    auVar81 = vsubps_avx(ZEXT1632(auVar63),ZEXT1632(auVar61));
    auVar83 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar80 = vmulps_avx512vl(auVar80,auVar83);
    auVar81 = vmulps_avx512vl(auVar81,auVar83);
    auVar191._0_4_ = fVar109 * auVar80._0_4_;
    auVar191._4_4_ = fVar109 * auVar80._4_4_;
    auVar191._8_4_ = fVar109 * auVar80._8_4_;
    auVar191._12_4_ = fVar109 * auVar80._12_4_;
    auVar191._16_4_ = fVar109 * auVar80._16_4_;
    auVar191._20_4_ = fVar109 * auVar80._20_4_;
    auVar191._24_4_ = fVar109 * auVar80._24_4_;
    auVar191._28_4_ = 0;
    auVar80 = vmulps_avx512vl(auVar197,auVar81);
    auVar61 = vxorps_avx512vl(auVar86._0_16_,auVar86._0_16_);
    auVar81 = vpermt2ps_avx512vl(ZEXT1632(auVar72),_DAT_01fb9fc0,ZEXT1632(auVar61));
    auVar84 = vpermt2ps_avx512vl(ZEXT1632(auVar75),_DAT_01fb9fc0,ZEXT1632(auVar61));
    auVar125._0_4_ = auVar191._0_4_ + auVar72._0_4_;
    auVar125._4_4_ = auVar191._4_4_ + auVar72._4_4_;
    auVar125._8_4_ = auVar191._8_4_ + auVar72._8_4_;
    auVar125._12_4_ = auVar191._12_4_ + auVar72._12_4_;
    auVar125._16_4_ = auVar191._16_4_ + 0.0;
    auVar125._20_4_ = auVar191._20_4_ + 0.0;
    auVar125._24_4_ = auVar191._24_4_ + 0.0;
    auVar125._28_4_ = 0;
    auVar94 = ZEXT1632(auVar61);
    auVar85 = vpermt2ps_avx512vl(auVar191,_DAT_01fb9fc0,auVar94);
    auVar86 = vaddps_avx512vl(ZEXT1632(auVar75),auVar80);
    auVar87 = vpermt2ps_avx512vl(auVar80,_DAT_01fb9fc0,auVar94);
    auVar80 = vsubps_avx(auVar81,auVar85);
    auVar85 = vsubps_avx512vl(auVar84,auVar87);
    auVar87 = vmulps_avx512vl(auVar88,auVar91);
    auVar90 = vmulps_avx512vl(auVar92,auVar91);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar82,auVar78);
    auVar78 = vfmadd231ps_avx512vl(auVar90,auVar82,auVar79);
    auVar79 = vmulps_avx512vl(auVar76,auVar91);
    auVar90 = vmulps_avx512vl(auVar93,auVar91);
    auVar79 = vfmadd231ps_avx512vl(auVar79,auVar82,auVar88);
    auVar92 = vfmadd231ps_avx512vl(auVar90,auVar82,auVar92);
    auVar88 = vmulps_avx512vl(auVar77,auVar91);
    auVar77 = vmulps_avx512vl(auVar89,auVar91);
    auVar120 = vfmadd231ps_fma(auVar88,auVar82,auVar76);
    auVar88 = vfmadd231ps_avx512vl(auVar77,auVar82,auVar93);
    auVar76 = vmulps_avx512vl(auVar91,auVar79);
    auVar89 = ZEXT1632(auVar53);
    auVar77 = vmulps_avx512vl(auVar89,auVar92);
    auVar87 = vfmadd231ps_avx512vl(auVar76,auVar82,auVar87);
    auVar78 = vfmadd231ps_avx512vl(auVar77,auVar82,auVar78);
    auVar88 = vmulps_avx512vl(auVar89,auVar88);
    auVar79 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar221 * auVar120._12_4_,
                                            CONCAT48(fVar210 * auVar120._8_4_,
                                                     CONCAT44(fVar209 * auVar120._4_4_,
                                                              fVar208 * auVar120._0_4_)))),auVar82,
                         auVar79);
    auVar92 = vfmadd231ps_avx512vl(auVar88,auVar82,auVar92);
    auVar26._4_4_ = fVar209 * auVar79._4_4_;
    auVar26._0_4_ = fVar208 * auVar79._0_4_;
    auVar26._8_4_ = fVar210 * auVar79._8_4_;
    auVar26._12_4_ = fVar221 * auVar79._12_4_;
    auVar26._16_4_ = auVar79._16_4_ * 0.0;
    auVar26._20_4_ = auVar79._20_4_ * 0.0;
    auVar26._24_4_ = auVar79._24_4_ * 0.0;
    auVar26._28_4_ = auVar93._28_4_;
    auVar93 = vmulps_avx512vl(auVar89,auVar92);
    auVar88 = vfmadd231ps_avx512vl(auVar26,auVar82,auVar87);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar78,auVar82);
    auVar82 = vsubps_avx512vl(auVar79,auVar87);
    auVar92 = vsubps_avx512vl(auVar92,auVar78);
    auVar82 = vmulps_avx512vl(auVar82,auVar83);
    auVar92 = vmulps_avx512vl(auVar92,auVar83);
    fVar199 = fVar109 * auVar82._0_4_;
    fVar208 = fVar109 * auVar82._4_4_;
    auVar27._4_4_ = fVar208;
    auVar27._0_4_ = fVar199;
    fVar209 = fVar109 * auVar82._8_4_;
    auVar27._8_4_ = fVar209;
    fVar210 = fVar109 * auVar82._12_4_;
    auVar27._12_4_ = fVar210;
    fVar221 = fVar109 * auVar82._16_4_;
    auVar27._16_4_ = fVar221;
    fVar222 = fVar109 * auVar82._20_4_;
    auVar27._20_4_ = fVar222;
    fVar109 = fVar109 * auVar82._24_4_;
    auVar27._24_4_ = fVar109;
    auVar27._28_4_ = auVar82._28_4_;
    auVar92 = vmulps_avx512vl(auVar197,auVar92);
    auVar83 = vpermt2ps_avx512vl(auVar88,_DAT_01fb9fc0,auVar94);
    auVar87 = vpermt2ps_avx512vl(auVar93,_DAT_01fb9fc0,auVar94);
    auVar198._0_4_ = auVar88._0_4_ + fVar199;
    auVar198._4_4_ = auVar88._4_4_ + fVar208;
    auVar198._8_4_ = auVar88._8_4_ + fVar209;
    auVar198._12_4_ = auVar88._12_4_ + fVar210;
    auVar198._16_4_ = auVar88._16_4_ + fVar221;
    auVar198._20_4_ = auVar88._20_4_ + fVar222;
    auVar198._24_4_ = auVar88._24_4_ + fVar109;
    auVar198._28_4_ = auVar88._28_4_ + auVar82._28_4_;
    auVar82 = vpermt2ps_avx512vl(auVar27,_DAT_01fb9fc0,ZEXT1632(auVar61));
    auVar78 = vaddps_avx512vl(auVar93,auVar92);
    auVar92 = vpermt2ps_avx512vl(auVar92,_DAT_01fb9fc0,ZEXT1632(auVar61));
    auVar82 = vsubps_avx(auVar83,auVar82);
    auVar92 = vsubps_avx512vl(auVar87,auVar92);
    auVar138 = ZEXT1632(auVar72);
    auVar79 = vsubps_avx512vl(auVar88,auVar138);
    auVar150 = ZEXT1632(auVar75);
    auVar76 = vsubps_avx512vl(auVar93,auVar150);
    auVar77 = vsubps_avx512vl(auVar83,auVar81);
    auVar79 = vaddps_avx512vl(auVar79,auVar77);
    auVar77 = vsubps_avx512vl(auVar87,auVar84);
    auVar76 = vaddps_avx512vl(auVar76,auVar77);
    auVar77 = vmulps_avx512vl(auVar150,auVar79);
    auVar77 = vfnmadd231ps_avx512vl(auVar77,auVar138,auVar76);
    auVar89 = vmulps_avx512vl(auVar86,auVar79);
    auVar89 = vfnmadd231ps_avx512vl(auVar89,auVar125,auVar76);
    auVar90 = vmulps_avx512vl(auVar85,auVar79);
    auVar90 = vfnmadd231ps_avx512vl(auVar90,auVar80,auVar76);
    auVar91 = vmulps_avx512vl(auVar84,auVar79);
    auVar91 = vfnmadd231ps_avx512vl(auVar91,auVar81,auVar76);
    auVar94 = vmulps_avx512vl(auVar93,auVar79);
    auVar94 = vfnmadd231ps_avx512vl(auVar94,auVar88,auVar76);
    auVar95 = vmulps_avx512vl(auVar78,auVar79);
    auVar95 = vfnmadd231ps_avx512vl(auVar95,auVar198,auVar76);
    auVar96 = vmulps_avx512vl(auVar92,auVar79);
    auVar96 = vfnmadd231ps_avx512vl(auVar96,auVar82,auVar76);
    auVar79 = vmulps_avx512vl(auVar87,auVar79);
    auVar79 = vfnmadd231ps_avx512vl(auVar79,auVar83,auVar76);
    auVar76 = vminps_avx512vl(auVar77,auVar89);
    auVar77 = vmaxps_avx512vl(auVar77,auVar89);
    auVar89 = vminps_avx512vl(auVar90,auVar91);
    auVar76 = vminps_avx512vl(auVar76,auVar89);
    auVar89 = vmaxps_avx512vl(auVar90,auVar91);
    auVar77 = vmaxps_avx512vl(auVar77,auVar89);
    auVar89 = vminps_avx512vl(auVar94,auVar95);
    auVar90 = vmaxps_avx512vl(auVar94,auVar95);
    auVar91 = vminps_avx512vl(auVar96,auVar79);
    auVar89 = vminps_avx512vl(auVar89,auVar91);
    auVar76 = vminps_avx512vl(auVar76,auVar89);
    auVar79 = vmaxps_avx512vl(auVar96,auVar79);
    auVar79 = vmaxps_avx512vl(auVar90,auVar79);
    auVar79 = vmaxps_avx512vl(auVar77,auVar79);
    uVar16 = vcmpps_avx512vl(auVar76,local_260,2);
    uVar17 = vcmpps_avx512vl(auVar79,local_280,5);
    bVar35 = (byte)uVar16 & (byte)uVar17 & 0x7f;
    if (bVar35 != 0) {
      auVar79 = vsubps_avx512vl(auVar81,auVar138);
      auVar76 = vsubps_avx512vl(auVar84,auVar150);
      auVar77 = vsubps_avx512vl(auVar83,auVar88);
      auVar79 = vaddps_avx512vl(auVar79,auVar77);
      auVar77 = vsubps_avx512vl(auVar87,auVar93);
      auVar76 = vaddps_avx512vl(auVar76,auVar77);
      auVar77 = vmulps_avx512vl(auVar150,auVar79);
      auVar77 = vfnmadd231ps_avx512vl(auVar77,auVar76,auVar138);
      auVar86 = vmulps_avx512vl(auVar86,auVar79);
      auVar86 = vfnmadd213ps_avx512vl(auVar125,auVar76,auVar86);
      auVar85 = vmulps_avx512vl(auVar85,auVar79);
      auVar85 = vfnmadd213ps_avx512vl(auVar80,auVar76,auVar85);
      auVar80 = vmulps_avx512vl(auVar84,auVar79);
      auVar84 = vfnmadd231ps_avx512vl(auVar80,auVar76,auVar81);
      auVar80 = vmulps_avx512vl(auVar93,auVar79);
      auVar93 = vfnmadd231ps_avx512vl(auVar80,auVar76,auVar88);
      auVar80 = vmulps_avx512vl(auVar78,auVar79);
      auVar78 = vfnmadd213ps_avx512vl(auVar198,auVar76,auVar80);
      auVar80 = vmulps_avx512vl(auVar92,auVar79);
      auVar88 = vfnmadd213ps_avx512vl(auVar82,auVar76,auVar80);
      auVar82 = vmulps_avx512vl(auVar87,auVar79);
      auVar83 = vfnmadd231ps_avx512vl(auVar82,auVar83,auVar76);
      auVar80 = vminps_avx(auVar77,auVar86);
      auVar82 = vmaxps_avx(auVar77,auVar86);
      auVar81 = vminps_avx(auVar85,auVar84);
      auVar81 = vminps_avx(auVar80,auVar81);
      auVar80 = vmaxps_avx(auVar85,auVar84);
      auVar82 = vmaxps_avx(auVar82,auVar80);
      auVar92 = vminps_avx(auVar93,auVar78);
      auVar80 = vmaxps_avx(auVar93,auVar78);
      auVar93 = vminps_avx(auVar88,auVar83);
      auVar92 = vminps_avx(auVar92,auVar93);
      auVar92 = vminps_avx(auVar81,auVar92);
      auVar81 = vmaxps_avx(auVar88,auVar83);
      auVar80 = vmaxps_avx(auVar80,auVar81);
      auVar82 = vmaxps_avx(auVar82,auVar80);
      uVar16 = vcmpps_avx512vl(auVar82,local_280,5);
      uVar17 = vcmpps_avx512vl(auVar92,local_260,2);
      bVar35 = bVar35 & (byte)uVar16 & (byte)uVar17;
      if (bVar35 != 0) {
        auStack_430[uVar37] = (uint)bVar35;
        uVar16 = vmovlps_avx(auVar58);
        (&uStack_240)[uVar37] = uVar16;
        uVar43 = vmovlps_avx(auVar50);
        auStack_1a0[uVar37] = uVar43;
        uVar37 = (ulong)((int)uVar37 + 1);
      }
    }
    auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar242 = ZEXT1664(auVar58);
    auVar58 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar243 = ZEXT1664(auVar58);
    auVar58 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar244 = ZEXT1664(auVar58);
    auVar82 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar245 = ZEXT3264(auVar82);
    auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar246 = ZEXT1664(auVar58);
    auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar247 = ZEXT1664(auVar58);
    auVar248 = ZEXT3264(_DAT_01fb9fe0);
LAB_019fc1b6:
    do {
      do {
        do {
          if ((int)uVar37 == 0) {
            uVar117 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar21._4_4_ = uVar117;
            auVar21._0_4_ = uVar117;
            auVar21._8_4_ = uVar117;
            auVar21._12_4_ = uVar117;
            auVar21._16_4_ = uVar117;
            auVar21._20_4_ = uVar117;
            auVar21._24_4_ = uVar117;
            auVar21._28_4_ = uVar117;
            uVar16 = vcmpps_avx512vl(local_1c0,auVar21,2);
            uVar42 = (ulong)((uint)uVar42 & (uint)uVar16);
            goto LAB_019fb540;
          }
          uVar36 = (int)uVar37 - 1;
          uVar38 = (ulong)uVar36;
          uVar8 = auStack_430[uVar38];
          auVar50._8_8_ = 0;
          auVar50._0_8_ = auStack_1a0[uVar38];
          uVar43 = 0;
          for (uVar41 = (ulong)uVar8; (uVar41 & 1) == 0; uVar41 = uVar41 >> 1 | 0x8000000000000000)
          {
            uVar43 = uVar43 + 1;
          }
          uVar40 = uVar8 - 1 & uVar8;
          bVar46 = uVar40 == 0;
          auStack_430[uVar38] = uVar40;
          if (bVar46) {
            uVar37 = (ulong)uVar36;
          }
          auVar110._8_8_ = 0;
          auVar110._0_8_ = uVar43;
          auVar58 = vpunpcklqdq_avx(auVar110,ZEXT416((int)uVar43 + 1));
          auVar58 = vcvtqq2ps_avx512vl(auVar58);
          auVar58 = vmulps_avx512vl(auVar58,auVar246._0_16_);
          uVar117 = *(undefined4 *)((long)&uStack_240 + uVar38 * 8 + 4);
          auVar18._4_4_ = uVar117;
          auVar18._0_4_ = uVar117;
          auVar18._8_4_ = uVar117;
          auVar18._12_4_ = uVar117;
          auVar53 = vmulps_avx512vl(auVar58,auVar18);
          auVar120 = auVar247._0_16_;
          auVar58 = vsubps_avx512vl(auVar120,auVar58);
          uVar117 = *(undefined4 *)(&uStack_240 + uVar38);
          auVar19._4_4_ = uVar117;
          auVar19._0_4_ = uVar117;
          auVar19._8_4_ = uVar117;
          auVar19._12_4_ = uVar117;
          auVar58 = vfmadd231ps_avx512vl(auVar53,auVar58,auVar19);
          auVar53 = vmovshdup_avx(auVar58);
          fVar109 = auVar53._0_4_ - auVar58._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar109));
          if (uVar8 == 0 || bVar46) goto LAB_019fbcb8;
          auVar53 = vshufps_avx(auVar50,auVar50,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar109));
          auVar63 = vsubps_avx512vl(auVar120,auVar53);
          fVar199 = auVar53._0_4_;
          auVar145._0_4_ = fVar199 * fVar114;
          fVar208 = auVar53._4_4_;
          auVar145._4_4_ = fVar208 * fVar115;
          fVar209 = auVar53._8_4_;
          auVar145._8_4_ = fVar209 * fVar114;
          fVar210 = auVar53._12_4_;
          auVar145._12_4_ = fVar210 * fVar115;
          auVar155._0_4_ = fVar199 * fVar116;
          auVar155._4_4_ = fVar208 * fVar126;
          auVar155._8_4_ = fVar209 * fVar116;
          auVar155._12_4_ = fVar210 * fVar126;
          auVar162._0_4_ = fVar199 * fVar134;
          auVar162._4_4_ = fVar208 * fVar141;
          auVar162._8_4_ = fVar209 * fVar134;
          auVar162._12_4_ = fVar210 * fVar141;
          auVar127._0_4_ = fVar199 * fVar142;
          auVar127._4_4_ = fVar208 * fVar143;
          auVar127._8_4_ = fVar209 * fVar142;
          auVar127._12_4_ = fVar210 * fVar143;
          auVar53 = vfmadd231ps_fma(auVar145,auVar63,auVar56);
          auVar61 = vfmadd231ps_fma(auVar155,auVar63,auVar59);
          auVar62 = vfmadd231ps_fma(auVar162,auVar63,auVar54);
          auVar63 = vfmadd231ps_fma(auVar127,auVar63,auVar118);
          auVar139._16_16_ = auVar53;
          auVar139._0_16_ = auVar53;
          auVar151._16_16_ = auVar61;
          auVar151._0_16_ = auVar61;
          auVar159._16_16_ = auVar62;
          auVar159._0_16_ = auVar62;
          auVar80 = vpermps_avx512vl(auVar248._0_32_,ZEXT1632(auVar58));
          auVar82 = vsubps_avx(auVar151,auVar139);
          auVar61 = vfmadd213ps_fma(auVar82,auVar80,auVar139);
          auVar82 = vsubps_avx(auVar159,auVar151);
          auVar72 = vfmadd213ps_fma(auVar82,auVar80,auVar151);
          auVar53 = vsubps_avx(auVar63,auVar62);
          auVar152._16_16_ = auVar53;
          auVar152._0_16_ = auVar53;
          auVar53 = vfmadd213ps_fma(auVar152,auVar80,auVar159);
          auVar82 = vsubps_avx(ZEXT1632(auVar72),ZEXT1632(auVar61));
          auVar61 = vfmadd213ps_fma(auVar82,auVar80,ZEXT1632(auVar61));
          auVar82 = vsubps_avx(ZEXT1632(auVar53),ZEXT1632(auVar72));
          auVar53 = vfmadd213ps_fma(auVar82,auVar80,ZEXT1632(auVar72));
          auVar82 = vsubps_avx(ZEXT1632(auVar53),ZEXT1632(auVar61));
          auVar153 = vfmadd231ps_fma(ZEXT1632(auVar61),auVar82,auVar80);
          auVar82 = vmulps_avx512vl(auVar82,auVar245._0_32_);
          auVar98._16_16_ = auVar82._16_16_;
          fVar199 = fVar109 * 0.33333334;
          auVar163._0_8_ =
               CONCAT44(auVar153._4_4_ + fVar199 * auVar82._4_4_,
                        auVar153._0_4_ + fVar199 * auVar82._0_4_);
          auVar163._8_4_ = auVar153._8_4_ + fVar199 * auVar82._8_4_;
          auVar163._12_4_ = auVar153._12_4_ + fVar199 * auVar82._12_4_;
          auVar146._0_4_ = fVar199 * auVar82._16_4_;
          auVar146._4_4_ = fVar199 * auVar82._20_4_;
          auVar146._8_4_ = fVar199 * auVar82._24_4_;
          auVar146._12_4_ = fVar199 * auVar82._28_4_;
          auVar70 = vsubps_avx((undefined1  [16])0x0,auVar146);
          auVar72 = vshufpd_avx(auVar153,auVar153,3);
          auVar75 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar53 = vsubps_avx(auVar72,auVar153);
          auVar61 = vsubps_avx(auVar75,(undefined1  [16])0x0);
          auVar184._0_4_ = auVar53._0_4_ + auVar61._0_4_;
          auVar184._4_4_ = auVar53._4_4_ + auVar61._4_4_;
          auVar184._8_4_ = auVar53._8_4_ + auVar61._8_4_;
          auVar184._12_4_ = auVar53._12_4_ + auVar61._12_4_;
          auVar53 = vshufps_avx(auVar153,auVar153,0xb1);
          auVar61 = vshufps_avx(auVar163,auVar163,0xb1);
          auVar62 = vshufps_avx(auVar70,auVar70,0xb1);
          auVar63 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar233._4_4_ = auVar184._0_4_;
          auVar233._0_4_ = auVar184._0_4_;
          auVar233._8_4_ = auVar184._0_4_;
          auVar233._12_4_ = auVar184._0_4_;
          auVar66 = vshufps_avx(auVar184,auVar184,0x55);
          fVar199 = auVar66._0_4_;
          auVar194._0_4_ = auVar53._0_4_ * fVar199;
          fVar208 = auVar66._4_4_;
          auVar194._4_4_ = auVar53._4_4_ * fVar208;
          fVar209 = auVar66._8_4_;
          auVar194._8_4_ = auVar53._8_4_ * fVar209;
          fVar210 = auVar66._12_4_;
          auVar194._12_4_ = auVar53._12_4_ * fVar210;
          auVar201._0_4_ = auVar61._0_4_ * fVar199;
          auVar201._4_4_ = auVar61._4_4_ * fVar208;
          auVar201._8_4_ = auVar61._8_4_ * fVar209;
          auVar201._12_4_ = auVar61._12_4_ * fVar210;
          auVar213._0_4_ = auVar62._0_4_ * fVar199;
          auVar213._4_4_ = auVar62._4_4_ * fVar208;
          auVar213._8_4_ = auVar62._8_4_ * fVar209;
          auVar213._12_4_ = auVar62._12_4_ * fVar210;
          auVar185._0_4_ = auVar63._0_4_ * fVar199;
          auVar185._4_4_ = auVar63._4_4_ * fVar208;
          auVar185._8_4_ = auVar63._8_4_ * fVar209;
          auVar185._12_4_ = auVar63._12_4_ * fVar210;
          auVar53 = vfmadd231ps_fma(auVar194,auVar233,auVar153);
          auVar61 = vfmadd231ps_fma(auVar201,auVar233,auVar163);
          auVar68 = vfmadd231ps_fma(auVar213,auVar233,auVar70);
          auVar69 = vfmadd231ps_fma(auVar185,(undefined1  [16])0x0,auVar233);
          auVar66 = vshufpd_avx(auVar53,auVar53,1);
          auVar67 = vshufpd_avx(auVar61,auVar61,1);
          auVar64 = vshufpd_avx512vl(auVar68,auVar68,1);
          auVar65 = vshufpd_avx512vl(auVar69,auVar69,1);
          auVar62 = vminss_avx(auVar53,auVar61);
          auVar53 = vmaxss_avx(auVar61,auVar53);
          auVar63 = vminss_avx(auVar68,auVar69);
          auVar61 = vmaxss_avx(auVar69,auVar68);
          auVar62 = vminss_avx(auVar62,auVar63);
          auVar53 = vmaxss_avx(auVar61,auVar53);
          auVar63 = vminss_avx(auVar66,auVar67);
          auVar61 = vmaxss_avx(auVar67,auVar66);
          auVar66 = vminss_avx512f(auVar64,auVar65);
          auVar67 = vmaxss_avx512f(auVar65,auVar64);
          auVar61 = vmaxss_avx(auVar67,auVar61);
          auVar63 = vminss_avx512f(auVar63,auVar66);
          fVar208 = auVar61._0_4_;
          fVar199 = auVar53._0_4_;
          if (auVar62._0_4_ < 0.0001) {
            bVar47 = fVar208 == -0.0001;
            bVar44 = NAN(fVar208);
            if (fVar208 <= -0.0001) goto LAB_019fc3ee;
            break;
          }
LAB_019fc3ee:
          vucomiss_avx512f(auVar63);
          bVar47 = fVar208 <= -0.0001;
          bVar45 = -0.0001 < fVar199;
          bVar44 = bVar47;
          if (!bVar47) break;
          uVar16 = vcmpps_avx512vl(auVar62,SUB6416(ZEXT464(0x38d1b717),0),5);
          uVar17 = vcmpps_avx512vl(auVar63,SUB6416(ZEXT464(0x38d1b717),0),5);
          uVar36 = (uint)uVar16 & (uint)uVar17;
          bVar13 = (uVar36 & 1) == 0;
          bVar47 = bVar45 && bVar13;
          bVar44 = bVar45 && (uVar36 & 1) == 0;
        } while (!bVar45 || !bVar13);
        auVar68 = auVar250._0_16_;
        vcmpss_avx512f(auVar62,auVar68,1);
        uVar16 = vcmpss_avx512f(auVar53,auVar68,1);
        bVar45 = (bool)((byte)uVar16 & 1);
        auVar98._0_16_ = auVar251._0_16_;
        auVar97._4_28_ = auVar98._4_28_;
        auVar97._0_4_ = (float)((uint)bVar45 * -0x40800000 + (uint)!bVar45 * auVar251._0_4_);
        vucomiss_avx512f(auVar97._0_16_);
        bVar44 = (bool)(!bVar47 | bVar44);
        bVar45 = bVar44 == false;
        auVar100._16_16_ = auVar98._16_16_;
        auVar100._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar99._4_28_ = auVar100._4_28_;
        auVar99._0_4_ = (uint)bVar44 * auVar250._0_4_ + (uint)!bVar44 * 0x7f800000;
        auVar67 = auVar99._0_16_;
        auVar102._16_16_ = auVar98._16_16_;
        auVar102._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar101._4_28_ = auVar102._4_28_;
        auVar101._0_4_ = (uint)bVar44 * auVar250._0_4_ + (uint)!bVar44 * -0x800000;
        auVar66 = auVar101._0_16_;
        uVar16 = vcmpss_avx512f(auVar63,auVar68,1);
        bVar47 = (bool)((byte)uVar16 & 1);
        auVar104._16_16_ = auVar98._16_16_;
        auVar104._0_16_ = auVar251._0_16_;
        auVar103._4_28_ = auVar104._4_28_;
        auVar103._0_4_ = (float)((uint)bVar47 * -0x40800000 + (uint)!bVar47 * auVar251._0_4_);
        vucomiss_avx512f(auVar103._0_16_);
        if ((bVar44) || (bVar45)) {
          auVar63 = vucomiss_avx512f(auVar62);
          if ((bVar44) || (bVar45)) {
            auVar69 = vxorps_avx512vl(auVar62,auVar244._0_16_);
            auVar62 = vsubss_avx512f(auVar63,auVar62);
            auVar62 = vdivss_avx512f(auVar69,auVar62);
            auVar63 = vsubss_avx512f(ZEXT416(0x3f800000),auVar62);
            auVar63 = vfmadd213ss_avx512f(auVar63,auVar68,auVar62);
            auVar62 = auVar63;
          }
          else {
            auVar62 = vxorps_avx512vl(auVar63,auVar63);
            vucomiss_avx512f(auVar62);
            auVar63 = ZEXT416(0x3f800000);
            if ((bVar44) || (bVar45)) {
              auVar63 = SUB6416(ZEXT464(0xff800000),0);
              auVar62 = ZEXT416(0x7f800000);
            }
          }
          auVar67 = vminss_avx512f(auVar67,auVar62);
          auVar66 = vmaxss_avx(auVar63,auVar66);
        }
        auVar251 = ZEXT464(0x3f800000);
        uVar16 = vcmpss_avx512f(auVar61,auVar68,1);
        bVar47 = (bool)((byte)uVar16 & 1);
        auVar61 = auVar251._0_16_;
        fVar209 = (float)((uint)bVar47 * -0x40800000 + (uint)!bVar47 * 0x3f800000);
        if ((auVar97._0_4_ != fVar209) || (NAN(auVar97._0_4_) || NAN(fVar209))) {
          if ((fVar208 != fVar199) || (NAN(fVar208) || NAN(fVar199))) {
            auVar53 = vxorps_avx512vl(auVar53,auVar244._0_16_);
            auVar186._0_4_ = auVar53._0_4_ / (fVar208 - fVar199);
            auVar186._4_12_ = auVar53._4_12_;
            auVar53 = vsubss_avx512f(auVar61,auVar186);
            auVar53 = vfmadd213ss_avx512f(auVar53,auVar68,auVar186);
            auVar62 = auVar53;
          }
          else if ((fVar199 != 0.0) ||
                  (auVar53 = auVar61, auVar62 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar199))) {
            auVar53 = SUB6416(ZEXT464(0xff800000),0);
            auVar62 = SUB6416(ZEXT464(0x7f800000),0);
          }
          auVar67 = vminss_avx(auVar67,auVar62);
          auVar66 = vmaxss_avx(auVar53,auVar66);
        }
        bVar47 = auVar103._0_4_ != fVar209;
        auVar53 = vminss_avx512f(auVar67,auVar61);
        auVar106._16_16_ = auVar98._16_16_;
        auVar106._0_16_ = auVar67;
        auVar105._4_28_ = auVar106._4_28_;
        auVar105._0_4_ = (uint)bVar47 * auVar53._0_4_ + (uint)!bVar47 * auVar67._0_4_;
        auVar53 = vmaxss_avx512f(auVar61,auVar66);
        auVar108._16_16_ = auVar98._16_16_;
        auVar108._0_16_ = auVar66;
        auVar107._4_28_ = auVar108._4_28_;
        auVar107._0_4_ = (uint)bVar47 * auVar53._0_4_ + (uint)!bVar47 * auVar66._0_4_;
        auVar53 = vmaxss_avx512f(auVar68,auVar105._0_16_);
        auVar62 = vminss_avx512f(auVar107._0_16_,auVar61);
      } while (auVar62._0_4_ < auVar53._0_4_);
      auVar68 = vmaxss_avx512f(auVar68,ZEXT416((uint)(auVar53._0_4_ + -0.1)));
      auVar69 = vminss_avx512f(ZEXT416((uint)(auVar62._0_4_ + 0.1)),auVar61);
      auVar128._0_8_ = auVar153._0_8_;
      auVar128._8_8_ = auVar128._0_8_;
      auVar202._8_8_ = auVar163._0_8_;
      auVar202._0_8_ = auVar163._0_8_;
      auVar214._8_8_ = auVar70._0_8_;
      auVar214._0_8_ = auVar70._0_8_;
      auVar53 = vshufpd_avx(auVar163,auVar163,3);
      auVar62 = vshufpd_avx(auVar70,auVar70,3);
      auVar63 = vshufps_avx(auVar68,auVar69,0);
      auVar67 = vsubps_avx512vl(auVar120,auVar63);
      fVar199 = auVar63._0_4_;
      auVar156._0_4_ = fVar199 * auVar72._0_4_;
      fVar208 = auVar63._4_4_;
      auVar156._4_4_ = fVar208 * auVar72._4_4_;
      fVar209 = auVar63._8_4_;
      auVar156._8_4_ = fVar209 * auVar72._8_4_;
      fVar210 = auVar63._12_4_;
      auVar156._12_4_ = fVar210 * auVar72._12_4_;
      auVar164._0_4_ = fVar199 * auVar53._0_4_;
      auVar164._4_4_ = fVar208 * auVar53._4_4_;
      auVar164._8_4_ = fVar209 * auVar53._8_4_;
      auVar164._12_4_ = fVar210 * auVar53._12_4_;
      auVar236._0_4_ = auVar62._0_4_ * fVar199;
      auVar236._4_4_ = auVar62._4_4_ * fVar208;
      auVar236._8_4_ = auVar62._8_4_ * fVar209;
      auVar236._12_4_ = auVar62._12_4_ * fVar210;
      auVar147._0_4_ = fVar199 * auVar75._0_4_;
      auVar147._4_4_ = fVar208 * auVar75._4_4_;
      auVar147._8_4_ = fVar209 * auVar75._8_4_;
      auVar147._12_4_ = fVar210 * auVar75._12_4_;
      auVar72 = vfmadd231ps_fma(auVar156,auVar67,auVar128);
      auVar75 = vfmadd231ps_fma(auVar164,auVar67,auVar202);
      auVar66 = vfmadd231ps_fma(auVar236,auVar67,auVar214);
      auVar67 = vfmadd231ps_fma(auVar147,auVar67,ZEXT816(0));
      auVar62 = vsubss_avx512f(auVar61,auVar68);
      auVar53 = vmovshdup_avx(auVar50);
      auVar153 = vfmadd231ss_fma(ZEXT416((uint)(auVar53._0_4_ * auVar68._0_4_)),auVar50,auVar62);
      auVar62 = vsubss_avx512f(auVar61,auVar69);
      auVar64 = vfmadd231ss_fma(ZEXT416((uint)(auVar53._0_4_ * auVar69._0_4_)),auVar50,auVar62);
      auVar70 = vdivss_avx512f(auVar61,ZEXT416((uint)fVar109));
      auVar50 = vsubps_avx(auVar75,auVar72);
      auVar68 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar62 = vmulps_avx512vl(auVar50,auVar68);
      auVar50 = vsubps_avx(auVar66,auVar75);
      auVar63 = vmulps_avx512vl(auVar50,auVar68);
      auVar50 = vsubps_avx(auVar67,auVar66);
      auVar50 = vmulps_avx512vl(auVar50,auVar68);
      auVar53 = vminps_avx(auVar63,auVar50);
      auVar50 = vmaxps_avx(auVar63,auVar50);
      auVar53 = vminps_avx(auVar62,auVar53);
      auVar50 = vmaxps_avx(auVar62,auVar50);
      auVar62 = vshufpd_avx(auVar53,auVar53,3);
      auVar63 = vshufpd_avx(auVar50,auVar50,3);
      auVar53 = vminps_avx(auVar53,auVar62);
      auVar50 = vmaxps_avx(auVar50,auVar63);
      fVar109 = auVar70._0_4_;
      auVar187._0_4_ = auVar53._0_4_ * fVar109;
      auVar187._4_4_ = auVar53._4_4_ * fVar109;
      auVar187._8_4_ = auVar53._8_4_ * fVar109;
      auVar187._12_4_ = auVar53._12_4_ * fVar109;
      auVar172._0_4_ = fVar109 * auVar50._0_4_;
      auVar172._4_4_ = fVar109 * auVar50._4_4_;
      auVar172._8_4_ = fVar109 * auVar50._8_4_;
      auVar172._12_4_ = fVar109 * auVar50._12_4_;
      auVar70 = vdivss_avx512f(auVar61,ZEXT416((uint)(auVar64._0_4_ - auVar153._0_4_)));
      auVar50 = vshufpd_avx(auVar72,auVar72,3);
      auVar53 = vshufpd_avx(auVar75,auVar75,3);
      auVar62 = vshufpd_avx(auVar66,auVar66,3);
      auVar63 = vshufpd_avx(auVar67,auVar67,3);
      auVar50 = vsubps_avx(auVar50,auVar72);
      auVar72 = vsubps_avx(auVar53,auVar75);
      auVar75 = vsubps_avx(auVar62,auVar66);
      auVar63 = vsubps_avx(auVar63,auVar67);
      auVar53 = vminps_avx(auVar50,auVar72);
      auVar50 = vmaxps_avx(auVar50,auVar72);
      auVar62 = vminps_avx(auVar75,auVar63);
      auVar62 = vminps_avx(auVar53,auVar62);
      auVar53 = vmaxps_avx(auVar75,auVar63);
      auVar50 = vmaxps_avx(auVar50,auVar53);
      fVar109 = auVar70._0_4_;
      auVar215._0_4_ = fVar109 * auVar62._0_4_;
      auVar215._4_4_ = fVar109 * auVar62._4_4_;
      auVar215._8_4_ = fVar109 * auVar62._8_4_;
      auVar215._12_4_ = fVar109 * auVar62._12_4_;
      auVar203._0_4_ = fVar109 * auVar50._0_4_;
      auVar203._4_4_ = fVar109 * auVar50._4_4_;
      auVar203._8_4_ = fVar109 * auVar50._8_4_;
      auVar203._12_4_ = fVar109 * auVar50._12_4_;
      auVar63 = vinsertps_avx(auVar58,auVar153,0x10);
      auVar65 = vpermt2ps_avx512vl(auVar58,_DAT_01fb9f90,auVar64);
      auVar119._0_4_ = auVar63._0_4_ + auVar65._0_4_;
      auVar119._4_4_ = auVar63._4_4_ + auVar65._4_4_;
      auVar119._8_4_ = auVar63._8_4_ + auVar65._8_4_;
      auVar119._12_4_ = auVar63._12_4_ + auVar65._12_4_;
      auVar70 = vmulps_avx512vl(auVar119,auVar242._0_16_);
      auVar53 = vshufps_avx(auVar70,auVar70,0x54);
      uVar117 = auVar70._0_4_;
      auVar122._4_4_ = uVar117;
      auVar122._0_4_ = uVar117;
      auVar122._8_4_ = uVar117;
      auVar122._12_4_ = uVar117;
      auVar62 = vfmadd213ps_fma(auVar48,auVar122,auVar4);
      auVar72 = vfmadd213ps_fma(auVar60,auVar122,auVar57);
      auVar75 = vfmadd213ps_fma(local_290,auVar122,auVar55);
      auVar50 = vsubps_avx(auVar72,auVar62);
      auVar62 = vfmadd213ps_fma(auVar50,auVar122,auVar62);
      auVar50 = vsubps_avx(auVar75,auVar72);
      auVar50 = vfmadd213ps_fma(auVar50,auVar122,auVar72);
      auVar50 = vsubps_avx(auVar50,auVar62);
      auVar62 = vfmadd231ps_fma(auVar62,auVar50,auVar122);
      auVar66 = vmulps_avx512vl(auVar50,auVar68);
      auVar225._8_8_ = auVar62._0_8_;
      auVar225._0_8_ = auVar62._0_8_;
      auVar50 = vshufpd_avx(auVar62,auVar62,3);
      auVar62 = vshufps_avx(auVar70,auVar70,0x55);
      auVar72 = vsubps_avx(auVar50,auVar225);
      auVar75 = vfmadd231ps_fma(auVar225,auVar62,auVar72);
      auVar237._8_8_ = auVar66._0_8_;
      auVar237._0_8_ = auVar66._0_8_;
      auVar50 = vshufpd_avx(auVar66,auVar66,3);
      auVar50 = vsubps_avx512vl(auVar50,auVar237);
      auVar50 = vfmadd213ps_avx512vl(auVar50,auVar62,auVar237);
      auVar123._0_8_ = auVar72._0_8_ ^ 0x8000000080000000;
      auVar123._8_4_ = auVar72._8_4_ ^ 0x80000000;
      auVar123._12_4_ = auVar72._12_4_ ^ 0x80000000;
      auVar62 = vmovshdup_avx512vl(auVar50);
      auVar238._0_8_ = auVar62._0_8_ ^ 0x8000000080000000;
      auVar238._8_4_ = auVar62._8_4_ ^ 0x80000000;
      auVar238._12_4_ = auVar62._12_4_ ^ 0x80000000;
      auVar66 = vmovshdup_avx512vl(auVar72);
      auVar67 = vpermt2ps_avx512vl(auVar238,ZEXT416(5),auVar72);
      auVar71 = vxorps_avx512vl(ZEXT416(5),ZEXT416(5));
      auVar250 = ZEXT1664(auVar71);
      auVar62 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar62._0_4_ * auVar72._0_4_)),auVar50,auVar66);
      auVar72 = vpermt2ps_avx512vl(auVar50,SUB6416(ZEXT464(4),0),auVar123);
      auVar148._0_4_ = auVar62._0_4_;
      auVar148._4_4_ = auVar148._0_4_;
      auVar148._8_4_ = auVar148._0_4_;
      auVar148._12_4_ = auVar148._0_4_;
      auVar50 = vdivps_avx(auVar67,auVar148);
      auVar73 = vdivps_avx512vl(auVar72,auVar148);
      fVar109 = auVar75._0_4_;
      auVar62 = vshufps_avx(auVar75,auVar75,0x55);
      auVar226._0_4_ = fVar109 * auVar50._0_4_ + auVar62._0_4_ * auVar73._0_4_;
      auVar226._4_4_ = fVar109 * auVar50._4_4_ + auVar62._4_4_ * auVar73._4_4_;
      auVar226._8_4_ = fVar109 * auVar50._8_4_ + auVar62._8_4_ * auVar73._8_4_;
      auVar226._12_4_ = fVar109 * auVar50._12_4_ + auVar62._12_4_ * auVar73._12_4_;
      auVar68 = vsubps_avx(auVar53,auVar226);
      auVar62 = vmovshdup_avx(auVar50);
      auVar53 = vinsertps_avx(auVar187,auVar215,0x1c);
      auVar239._0_4_ = auVar62._0_4_ * auVar53._0_4_;
      auVar239._4_4_ = auVar62._4_4_ * auVar53._4_4_;
      auVar239._8_4_ = auVar62._8_4_ * auVar53._8_4_;
      auVar239._12_4_ = auVar62._12_4_ * auVar53._12_4_;
      auVar69 = vinsertps_avx512f(auVar172,auVar203,0x1c);
      auVar62 = vmulps_avx512vl(auVar62,auVar69);
      auVar67 = vminps_avx512vl(auVar239,auVar62);
      auVar75 = vmaxps_avx(auVar62,auVar239);
      auVar66 = vmovshdup_avx(auVar73);
      auVar62 = vinsertps_avx(auVar215,auVar187,0x4c);
      auVar216._0_4_ = auVar66._0_4_ * auVar62._0_4_;
      auVar216._4_4_ = auVar66._4_4_ * auVar62._4_4_;
      auVar216._8_4_ = auVar66._8_4_ * auVar62._8_4_;
      auVar216._12_4_ = auVar66._12_4_ * auVar62._12_4_;
      auVar72 = vinsertps_avx(auVar203,auVar172,0x4c);
      auVar204._0_4_ = auVar66._0_4_ * auVar72._0_4_;
      auVar204._4_4_ = auVar66._4_4_ * auVar72._4_4_;
      auVar204._8_4_ = auVar66._8_4_ * auVar72._8_4_;
      auVar204._12_4_ = auVar66._12_4_ * auVar72._12_4_;
      auVar66 = vminps_avx(auVar216,auVar204);
      auVar67 = vaddps_avx512vl(auVar67,auVar66);
      auVar66 = vmaxps_avx(auVar204,auVar216);
      auVar205._0_4_ = auVar75._0_4_ + auVar66._0_4_;
      auVar205._4_4_ = auVar75._4_4_ + auVar66._4_4_;
      auVar205._8_4_ = auVar75._8_4_ + auVar66._8_4_;
      auVar205._12_4_ = auVar75._12_4_ + auVar66._12_4_;
      auVar217._8_8_ = 0x3f80000000000000;
      auVar217._0_8_ = 0x3f80000000000000;
      auVar75 = vsubps_avx(auVar217,auVar205);
      auVar66 = vsubps_avx(auVar217,auVar67);
      auVar67 = vsubps_avx(auVar63,auVar70);
      auVar70 = vsubps_avx(auVar65,auVar70);
      fVar210 = auVar67._0_4_;
      auVar240._0_4_ = fVar210 * auVar75._0_4_;
      fVar221 = auVar67._4_4_;
      auVar240._4_4_ = fVar221 * auVar75._4_4_;
      fVar222 = auVar67._8_4_;
      auVar240._8_4_ = fVar222 * auVar75._8_4_;
      fVar223 = auVar67._12_4_;
      auVar240._12_4_ = fVar223 * auVar75._12_4_;
      auVar74 = vbroadcastss_avx512vl(auVar50);
      auVar53 = vmulps_avx512vl(auVar74,auVar53);
      auVar69 = vmulps_avx512vl(auVar74,auVar69);
      auVar74 = vminps_avx512vl(auVar53,auVar69);
      auVar69 = vmaxps_avx512vl(auVar69,auVar53);
      auVar53 = vbroadcastss_avx512vl(auVar73);
      auVar62 = vmulps_avx512vl(auVar53,auVar62);
      auVar53 = vmulps_avx512vl(auVar53,auVar72);
      auVar72 = vminps_avx512vl(auVar62,auVar53);
      auVar72 = vaddps_avx512vl(auVar74,auVar72);
      auVar67 = vmulps_avx512vl(auVar67,auVar66);
      fVar109 = auVar70._0_4_;
      auVar206._0_4_ = fVar109 * auVar75._0_4_;
      fVar199 = auVar70._4_4_;
      auVar206._4_4_ = fVar199 * auVar75._4_4_;
      fVar208 = auVar70._8_4_;
      auVar206._8_4_ = fVar208 * auVar75._8_4_;
      fVar209 = auVar70._12_4_;
      auVar206._12_4_ = fVar209 * auVar75._12_4_;
      auVar218._0_4_ = fVar109 * auVar66._0_4_;
      auVar218._4_4_ = fVar199 * auVar66._4_4_;
      auVar218._8_4_ = fVar208 * auVar66._8_4_;
      auVar218._12_4_ = fVar209 * auVar66._12_4_;
      auVar53 = vmaxps_avx(auVar53,auVar62);
      auVar173._0_4_ = auVar69._0_4_ + auVar53._0_4_;
      auVar173._4_4_ = auVar69._4_4_ + auVar53._4_4_;
      auVar173._8_4_ = auVar69._8_4_ + auVar53._8_4_;
      auVar173._12_4_ = auVar69._12_4_ + auVar53._12_4_;
      auVar188._8_8_ = 0x3f800000;
      auVar188._0_8_ = 0x3f800000;
      auVar53 = vsubps_avx(auVar188,auVar173);
      auVar62 = vsubps_avx512vl(auVar188,auVar72);
      auVar234._0_4_ = fVar210 * auVar53._0_4_;
      auVar234._4_4_ = fVar221 * auVar53._4_4_;
      auVar234._8_4_ = fVar222 * auVar53._8_4_;
      auVar234._12_4_ = fVar223 * auVar53._12_4_;
      auVar227._0_4_ = fVar210 * auVar62._0_4_;
      auVar227._4_4_ = fVar221 * auVar62._4_4_;
      auVar227._8_4_ = fVar222 * auVar62._8_4_;
      auVar227._12_4_ = fVar223 * auVar62._12_4_;
      auVar174._0_4_ = fVar109 * auVar53._0_4_;
      auVar174._4_4_ = fVar199 * auVar53._4_4_;
      auVar174._8_4_ = fVar208 * auVar53._8_4_;
      auVar174._12_4_ = fVar209 * auVar53._12_4_;
      auVar189._0_4_ = fVar109 * auVar62._0_4_;
      auVar189._4_4_ = fVar199 * auVar62._4_4_;
      auVar189._8_4_ = fVar208 * auVar62._8_4_;
      auVar189._12_4_ = fVar209 * auVar62._12_4_;
      auVar53 = vminps_avx(auVar234,auVar227);
      auVar62 = vminps_avx512vl(auVar174,auVar189);
      auVar72 = vminps_avx512vl(auVar53,auVar62);
      auVar53 = vmaxps_avx(auVar227,auVar234);
      auVar62 = vmaxps_avx(auVar189,auVar174);
      auVar62 = vmaxps_avx(auVar62,auVar53);
      auVar75 = vminps_avx512vl(auVar240,auVar67);
      auVar53 = vminps_avx(auVar206,auVar218);
      auVar53 = vminps_avx(auVar75,auVar53);
      auVar53 = vhaddps_avx(auVar72,auVar53);
      auVar75 = vmaxps_avx512vl(auVar67,auVar240);
      auVar72 = vmaxps_avx(auVar218,auVar206);
      auVar72 = vmaxps_avx(auVar72,auVar75);
      auVar62 = vhaddps_avx(auVar62,auVar72);
      auVar53 = vshufps_avx(auVar53,auVar53,0xe8);
      auVar62 = vshufps_avx(auVar62,auVar62,0xe8);
      auVar175._0_4_ = auVar53._0_4_ + auVar68._0_4_;
      auVar175._4_4_ = auVar53._4_4_ + auVar68._4_4_;
      auVar175._8_4_ = auVar53._8_4_ + auVar68._8_4_;
      auVar175._12_4_ = auVar53._12_4_ + auVar68._12_4_;
      auVar190._0_4_ = auVar62._0_4_ + auVar68._0_4_;
      auVar190._4_4_ = auVar62._4_4_ + auVar68._4_4_;
      auVar190._8_4_ = auVar62._8_4_ + auVar68._8_4_;
      auVar190._12_4_ = auVar62._12_4_ + auVar68._12_4_;
      auVar53 = vmaxps_avx(auVar63,auVar175);
      auVar62 = vminps_avx(auVar190,auVar65);
      uVar43 = vcmpps_avx512vl(auVar62,auVar53,1);
    } while ((uVar43 & 3) != 0);
    uVar43 = vcmpps_avx512vl(auVar190,auVar65,1);
    uVar16 = vcmpps_avx512vl(auVar58,auVar175,1);
    if (((ushort)uVar16 & (ushort)uVar43 & 1) == 0) {
      bVar35 = 0;
    }
    else {
      auVar53 = vmovshdup_avx(auVar175);
      bVar35 = auVar153._0_4_ < auVar53._0_4_ & (byte)(uVar43 >> 1) & 0x7f;
    }
    if (((3 < (uint)uVar37 || uVar8 != 0 && !bVar46) | bVar35) == 1) {
      lVar39 = 0xc9;
      do {
        lVar39 = lVar39 + -1;
        if (lVar39 == 0) goto LAB_019fc1b6;
        auVar58 = vsubss_avx512f(auVar61,auVar68);
        fVar208 = auVar58._0_4_;
        fVar109 = fVar208 * fVar208 * fVar208;
        fVar209 = auVar68._0_4_;
        fVar199 = fVar209 * 3.0 * fVar208 * fVar208;
        fVar208 = fVar208 * fVar209 * fVar209 * 3.0;
        auVar136._4_4_ = fVar109;
        auVar136._0_4_ = fVar109;
        auVar136._8_4_ = fVar109;
        auVar136._12_4_ = fVar109;
        auVar129._4_4_ = fVar199;
        auVar129._0_4_ = fVar199;
        auVar129._8_4_ = fVar199;
        auVar129._12_4_ = fVar199;
        auVar111._4_4_ = fVar208;
        auVar111._0_4_ = fVar208;
        auVar111._8_4_ = fVar208;
        auVar111._12_4_ = fVar208;
        fVar209 = fVar209 * fVar209 * fVar209;
        auVar157._0_4_ = (float)local_2a0._0_4_ * fVar209;
        auVar157._4_4_ = (float)local_2a0._4_4_ * fVar209;
        auVar157._8_4_ = fStack_298 * fVar209;
        auVar157._12_4_ = fStack_294 * fVar209;
        auVar58 = vfmadd231ps_fma(auVar157,auVar55,auVar111);
        auVar58 = vfmadd231ps_fma(auVar58,auVar57,auVar129);
        auVar58 = vfmadd231ps_fma(auVar58,auVar4,auVar136);
        auVar112._8_8_ = auVar58._0_8_;
        auVar112._0_8_ = auVar58._0_8_;
        auVar58 = vshufpd_avx(auVar58,auVar58,3);
        auVar53 = vshufps_avx(auVar68,auVar68,0x55);
        auVar58 = vsubps_avx(auVar58,auVar112);
        auVar53 = vfmadd213ps_fma(auVar58,auVar53,auVar112);
        fVar109 = auVar53._0_4_;
        auVar58 = vshufps_avx(auVar53,auVar53,0x55);
        auVar113._0_4_ = auVar50._0_4_ * fVar109 + auVar73._0_4_ * auVar58._0_4_;
        auVar113._4_4_ = auVar50._4_4_ * fVar109 + auVar73._4_4_ * auVar58._4_4_;
        auVar113._8_4_ = auVar50._8_4_ * fVar109 + auVar73._8_4_ * auVar58._8_4_;
        auVar113._12_4_ = auVar50._12_4_ * fVar109 + auVar73._12_4_ * auVar58._12_4_;
        auVar68 = vsubps_avx(auVar68,auVar113);
        auVar58 = vandps_avx512vl(auVar53,auVar243._0_16_);
        auVar53 = vprolq_avx512vl(auVar58,0x20);
        auVar58 = vmaxss_avx(auVar53,auVar58);
        bVar46 = auVar58._0_4_ <= (float)local_2b0._0_4_;
      } while ((float)local_2b0._0_4_ <= auVar58._0_4_);
      auVar58 = vucomiss_avx512f(auVar71);
      if (bVar46) {
        auVar50 = vucomiss_avx512f(auVar58);
        auVar251 = ZEXT1664(auVar50);
        if (bVar46) {
          vmovshdup_avx(auVar58);
          auVar50 = vucomiss_avx512f(auVar71);
          if (bVar46) {
            auVar53 = vucomiss_avx512f(auVar50);
            auVar251 = ZEXT1664(auVar53);
            if (bVar46) {
              auVar61 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                      ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
              auVar70 = vinsertps_avx(auVar61,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),
                                      0x28);
              auVar61 = vdpps_avx(auVar70,local_2c0,0x7f);
              auVar62 = vdpps_avx(auVar70,local_2d0,0x7f);
              auVar63 = vdpps_avx(auVar70,local_2e0,0x7f);
              auVar72 = vdpps_avx(auVar70,local_2f0,0x7f);
              auVar75 = vdpps_avx(auVar70,local_300,0x7f);
              auVar66 = vdpps_avx(auVar70,local_310,0x7f);
              auVar67 = vdpps_avx(auVar70,local_320,0x7f);
              auVar70 = vdpps_avx(auVar70,local_330,0x7f);
              auVar68 = vsubss_avx512f(auVar53,auVar50);
              fVar209 = auVar50._0_4_;
              auVar50 = vfmadd231ss_fma(ZEXT416((uint)(fVar209 * auVar75._0_4_)),auVar68,auVar61);
              auVar61 = vfmadd231ss_fma(ZEXT416((uint)(auVar66._0_4_ * fVar209)),auVar68,auVar62);
              auVar62 = vfmadd231ss_fma(ZEXT416((uint)(auVar67._0_4_ * fVar209)),auVar68,auVar63);
              auVar63 = vfmadd231ss_fma(ZEXT416((uint)(fVar209 * auVar70._0_4_)),auVar68,auVar72);
              auVar53 = vsubss_avx512f(auVar53,auVar58);
              auVar165._0_4_ = auVar53._0_4_;
              fVar109 = auVar165._0_4_ * auVar165._0_4_ * auVar165._0_4_;
              local_120 = auVar58._0_4_;
              fVar199 = local_120 * 3.0 * auVar165._0_4_ * auVar165._0_4_;
              fVar208 = auVar165._0_4_ * local_120 * local_120 * 3.0;
              fVar221 = local_120 * local_120 * local_120;
              auVar53 = vfmadd231ss_fma(ZEXT416((uint)(fVar221 * auVar63._0_4_)),
                                        ZEXT416((uint)fVar208),auVar62);
              auVar53 = vfmadd231ss_fma(auVar53,ZEXT416((uint)fVar199),auVar61);
              auVar50 = vfmadd231ss_fma(auVar53,ZEXT416((uint)fVar109),auVar50);
              fVar210 = auVar50._0_4_;
              if ((fVar1 <= fVar210) &&
                 (fVar222 = *(float *)(ray + k * 4 + 0x100), fVar210 <= fVar222)) {
                auVar50 = vshufps_avx(auVar58,auVar58,0x55);
                auVar61 = vsubps_avx512vl(auVar120,auVar50);
                fVar223 = auVar50._0_4_;
                auVar195._0_4_ = fVar223 * (float)local_350._0_4_;
                fVar224 = auVar50._4_4_;
                auVar195._4_4_ = fVar224 * (float)local_350._4_4_;
                fVar228 = auVar50._8_4_;
                auVar195._8_4_ = fVar228 * fStack_348;
                fVar229 = auVar50._12_4_;
                auVar195._12_4_ = fVar229 * fStack_344;
                auVar207._0_4_ = fVar223 * (float)local_3a0._0_4_;
                auVar207._4_4_ = fVar224 * (float)local_3a0._4_4_;
                auVar207._8_4_ = fVar228 * fStack_398;
                auVar207._12_4_ = fVar229 * fStack_394;
                auVar219._0_4_ = fVar223 * (float)local_3b0._0_4_;
                auVar219._4_4_ = fVar224 * (float)local_3b0._4_4_;
                auVar219._8_4_ = fVar228 * fStack_3a8;
                auVar219._12_4_ = fVar229 * fStack_3a4;
                auVar176._0_4_ = fVar223 * (float)local_370._0_4_;
                auVar176._4_4_ = fVar224 * (float)local_370._4_4_;
                auVar176._8_4_ = fVar228 * fStack_368;
                auVar176._12_4_ = fVar229 * fStack_364;
                auVar50 = vfmadd231ps_fma(auVar195,auVar61,local_340);
                auVar53 = vfmadd231ps_fma(auVar207,auVar61,local_380);
                auVar120 = vfmadd231ps_fma(auVar219,auVar61,local_390);
                auVar61 = vfmadd231ps_fma(auVar176,auVar61,local_360);
                auVar50 = vsubps_avx(auVar53,auVar50);
                auVar53 = vsubps_avx(auVar120,auVar53);
                auVar120 = vsubps_avx(auVar61,auVar120);
                auVar220._0_4_ = local_120 * auVar53._0_4_;
                auVar220._4_4_ = local_120 * auVar53._4_4_;
                auVar220._8_4_ = local_120 * auVar53._8_4_;
                auVar220._12_4_ = local_120 * auVar53._12_4_;
                auVar165._4_4_ = auVar165._0_4_;
                auVar165._8_4_ = auVar165._0_4_;
                auVar165._12_4_ = auVar165._0_4_;
                auVar50 = vfmadd231ps_fma(auVar220,auVar165,auVar50);
                auVar177._0_4_ = local_120 * auVar120._0_4_;
                auVar177._4_4_ = local_120 * auVar120._4_4_;
                auVar177._8_4_ = local_120 * auVar120._8_4_;
                auVar177._12_4_ = local_120 * auVar120._12_4_;
                auVar53 = vfmadd231ps_fma(auVar177,auVar165,auVar53);
                auVar178._0_4_ = local_120 * auVar53._0_4_;
                auVar178._4_4_ = local_120 * auVar53._4_4_;
                auVar178._8_4_ = local_120 * auVar53._8_4_;
                auVar178._12_4_ = local_120 * auVar53._12_4_;
                auVar50 = vfmadd231ps_fma(auVar178,auVar165,auVar50);
                auVar20._8_4_ = 0x40400000;
                auVar20._0_8_ = 0x4040000040400000;
                auVar20._12_4_ = 0x40400000;
                auVar50 = vmulps_avx512vl(auVar50,auVar20);
                pGVar9 = (context->scene->geometries).items[uVar6].ptr;
                if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  auVar158._0_4_ = fVar221 * (float)local_3f0._0_4_;
                  auVar158._4_4_ = fVar221 * (float)local_3f0._4_4_;
                  auVar158._8_4_ = fVar221 * fStack_3e8;
                  auVar158._12_4_ = fVar221 * fStack_3e4;
                  auVar149._4_4_ = fVar208;
                  auVar149._0_4_ = fVar208;
                  auVar149._8_4_ = fVar208;
                  auVar149._12_4_ = fVar208;
                  auVar53 = vfmadd132ps_fma(auVar149,auVar158,local_3e0);
                  auVar137._4_4_ = fVar199;
                  auVar137._0_4_ = fVar199;
                  auVar137._8_4_ = fVar199;
                  auVar137._12_4_ = fVar199;
                  auVar53 = vfmadd132ps_fma(auVar137,auVar53,local_3d0);
                  auVar130._4_4_ = fVar109;
                  auVar130._0_4_ = fVar109;
                  auVar130._8_4_ = fVar109;
                  auVar130._12_4_ = fVar109;
                  auVar61 = vfmadd132ps_fma(auVar130,auVar53,local_3c0);
                  auVar53 = vshufps_avx(auVar61,auVar61,0xc9);
                  auVar120 = vshufps_avx(auVar50,auVar50,0xc9);
                  auVar131._0_4_ = auVar61._0_4_ * auVar120._0_4_;
                  auVar131._4_4_ = auVar61._4_4_ * auVar120._4_4_;
                  auVar131._8_4_ = auVar61._8_4_ * auVar120._8_4_;
                  auVar131._12_4_ = auVar61._12_4_ * auVar120._12_4_;
                  auVar50 = vfmsub231ps_fma(auVar131,auVar50,auVar53);
                  local_140 = auVar50._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x100) = fVar210;
                    uVar117 = vextractps_avx(auVar50,1);
                    *(undefined4 *)(ray + k * 4 + 0x180) = uVar117;
                    uVar117 = vextractps_avx(auVar50,2);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar117;
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = local_140;
                    *(float *)(ray + k * 4 + 0x1e0) = local_120;
                    *(float *)(ray + k * 4 + 0x200) = fVar209;
                    *(uint *)(ray + k * 4 + 0x220) = uVar7;
                    *(uint *)(ray + k * 4 + 0x240) = uVar6;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                    goto LAB_019fc1b6;
                  }
                  auVar140._8_4_ = 1;
                  auVar140._0_8_ = 0x100000001;
                  auVar140._12_4_ = 1;
                  auVar140._16_4_ = 1;
                  auVar140._20_4_ = 1;
                  auVar140._24_4_ = 1;
                  auVar140._28_4_ = 1;
                  local_100 = vpermps_avx2(auVar140,ZEXT1632(auVar58));
                  auVar82 = vpermps_avx2(auVar140,ZEXT1632(auVar50));
                  local_160 = vpermps_avx512vl(auVar249._0_32_,ZEXT1632(auVar50));
                  local_180[0] = (RTCHitN)auVar82[0];
                  local_180[1] = (RTCHitN)auVar82[1];
                  local_180[2] = (RTCHitN)auVar82[2];
                  local_180[3] = (RTCHitN)auVar82[3];
                  local_180[4] = (RTCHitN)auVar82[4];
                  local_180[5] = (RTCHitN)auVar82[5];
                  local_180[6] = (RTCHitN)auVar82[6];
                  local_180[7] = (RTCHitN)auVar82[7];
                  local_180[8] = (RTCHitN)auVar82[8];
                  local_180[9] = (RTCHitN)auVar82[9];
                  local_180[10] = (RTCHitN)auVar82[10];
                  local_180[0xb] = (RTCHitN)auVar82[0xb];
                  local_180[0xc] = (RTCHitN)auVar82[0xc];
                  local_180[0xd] = (RTCHitN)auVar82[0xd];
                  local_180[0xe] = (RTCHitN)auVar82[0xe];
                  local_180[0xf] = (RTCHitN)auVar82[0xf];
                  local_180[0x10] = (RTCHitN)auVar82[0x10];
                  local_180[0x11] = (RTCHitN)auVar82[0x11];
                  local_180[0x12] = (RTCHitN)auVar82[0x12];
                  local_180[0x13] = (RTCHitN)auVar82[0x13];
                  local_180[0x14] = (RTCHitN)auVar82[0x14];
                  local_180[0x15] = (RTCHitN)auVar82[0x15];
                  local_180[0x16] = (RTCHitN)auVar82[0x16];
                  local_180[0x17] = (RTCHitN)auVar82[0x17];
                  local_180[0x18] = (RTCHitN)auVar82[0x18];
                  local_180[0x19] = (RTCHitN)auVar82[0x19];
                  local_180[0x1a] = (RTCHitN)auVar82[0x1a];
                  local_180[0x1b] = (RTCHitN)auVar82[0x1b];
                  local_180[0x1c] = (RTCHitN)auVar82[0x1c];
                  local_180[0x1d] = (RTCHitN)auVar82[0x1d];
                  local_180[0x1e] = (RTCHitN)auVar82[0x1e];
                  local_180[0x1f] = (RTCHitN)auVar82[0x1f];
                  uStack_13c = local_140;
                  uStack_138 = local_140;
                  uStack_134 = local_140;
                  uStack_130 = local_140;
                  uStack_12c = local_140;
                  uStack_128 = local_140;
                  uStack_124 = local_140;
                  fStack_11c = local_120;
                  fStack_118 = local_120;
                  fStack_114 = local_120;
                  fStack_110 = local_120;
                  fStack_10c = local_120;
                  fStack_108 = local_120;
                  fStack_104 = local_120;
                  local_e0 = local_200._0_8_;
                  uStack_d8 = local_200._8_8_;
                  uStack_d0 = local_200._16_8_;
                  uStack_c8 = local_200._24_8_;
                  local_c0 = local_1e0;
                  vpcmpeqd_avx2(local_1e0,local_1e0);
                  uStack_9c = context->user->instID[0];
                  local_a0 = uStack_9c;
                  uStack_98 = uStack_9c;
                  uStack_94 = uStack_9c;
                  uStack_90 = uStack_9c;
                  uStack_8c = uStack_9c;
                  uStack_88 = uStack_9c;
                  uStack_84 = uStack_9c;
                  uStack_7c = context->user->instPrimID[0];
                  local_80 = uStack_7c;
                  uStack_78 = uStack_7c;
                  uStack_74 = uStack_7c;
                  uStack_70 = uStack_7c;
                  uStack_6c = uStack_7c;
                  uStack_68 = uStack_7c;
                  uStack_64 = uStack_7c;
                  *(float *)(ray + k * 4 + 0x100) = fVar210;
                  local_420 = local_220;
                  local_460.valid = (int *)local_420;
                  local_460.geometryUserPtr = pGVar9->userPtr;
                  local_460.context = context->user;
                  local_460.hit = local_180;
                  local_460.N = 8;
                  local_460.ray = (RTCRayN *)ray;
                  if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar9->intersectionFilterN)(&local_460);
                    auVar58 = vxorps_avx512vl(auVar71,auVar71);
                    auVar250 = ZEXT1664(auVar58);
                    auVar251 = ZEXT464(0x3f800000);
                    auVar248 = ZEXT3264(_DAT_01fb9fe0);
                    auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar247 = ZEXT1664(auVar58);
                    auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                    auVar246 = ZEXT1664(auVar58);
                    auVar82 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                    auVar245 = ZEXT3264(auVar82);
                    auVar58 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                    auVar244 = ZEXT1664(auVar58);
                    auVar58 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar243 = ZEXT1664(auVar58);
                    auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                    auVar242 = ZEXT1664(auVar58);
                    auVar82 = vbroadcastss_avx512vl(ZEXT416(2));
                    auVar249 = ZEXT3264(auVar82);
                  }
                  auVar58 = auVar250._0_16_;
                  if (local_420 != (undefined1  [32])0x0) {
                    p_Var10 = context->args->filter;
                    if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var10)(&local_460);
                      auVar58 = vxorps_avx512vl(auVar58,auVar58);
                      auVar250 = ZEXT1664(auVar58);
                      auVar251 = ZEXT464(0x3f800000);
                      auVar248 = ZEXT3264(_DAT_01fb9fe0);
                      auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar247 = ZEXT1664(auVar58);
                      auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                      auVar246 = ZEXT1664(auVar58);
                      auVar82 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar245 = ZEXT3264(auVar82);
                      auVar58 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                      auVar244 = ZEXT1664(auVar58);
                      auVar58 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar243 = ZEXT1664(auVar58);
                      auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                      auVar242 = ZEXT1664(auVar58);
                      auVar82 = vbroadcastss_avx512vl(ZEXT416(2));
                      auVar249 = ZEXT3264(auVar82);
                    }
                    if (local_420 != (undefined1  [32])0x0) {
                      uVar43 = vptestmd_avx512vl(local_420,local_420);
                      iVar28 = *(int *)(local_460.hit + 4);
                      iVar29 = *(int *)(local_460.hit + 8);
                      iVar30 = *(int *)(local_460.hit + 0xc);
                      iVar31 = *(int *)(local_460.hit + 0x10);
                      iVar32 = *(int *)(local_460.hit + 0x14);
                      iVar33 = *(int *)(local_460.hit + 0x18);
                      iVar34 = *(int *)(local_460.hit + 0x1c);
                      bVar35 = (byte)uVar43;
                      bVar46 = (bool)((byte)(uVar43 >> 1) & 1);
                      bVar47 = (bool)((byte)(uVar43 >> 2) & 1);
                      bVar44 = (bool)((byte)(uVar43 >> 3) & 1);
                      bVar45 = (bool)((byte)(uVar43 >> 4) & 1);
                      bVar13 = (bool)((byte)(uVar43 >> 5) & 1);
                      bVar14 = (bool)((byte)(uVar43 >> 6) & 1);
                      bVar15 = SUB81(uVar43 >> 7,0);
                      *(uint *)(local_460.ray + 0x180) =
                           (uint)(bVar35 & 1) * *(int *)local_460.hit |
                           (uint)!(bool)(bVar35 & 1) * *(int *)(local_460.ray + 0x180);
                      *(uint *)(local_460.ray + 0x184) =
                           (uint)bVar46 * iVar28 | (uint)!bVar46 * *(int *)(local_460.ray + 0x184);
                      *(uint *)(local_460.ray + 0x188) =
                           (uint)bVar47 * iVar29 | (uint)!bVar47 * *(int *)(local_460.ray + 0x188);
                      *(uint *)(local_460.ray + 0x18c) =
                           (uint)bVar44 * iVar30 | (uint)!bVar44 * *(int *)(local_460.ray + 0x18c);
                      *(uint *)(local_460.ray + 400) =
                           (uint)bVar45 * iVar31 | (uint)!bVar45 * *(int *)(local_460.ray + 400);
                      *(uint *)(local_460.ray + 0x194) =
                           (uint)bVar13 * iVar32 | (uint)!bVar13 * *(int *)(local_460.ray + 0x194);
                      *(uint *)(local_460.ray + 0x198) =
                           (uint)bVar14 * iVar33 | (uint)!bVar14 * *(int *)(local_460.ray + 0x198);
                      *(uint *)(local_460.ray + 0x19c) =
                           (uint)bVar15 * iVar34 | (uint)!bVar15 * *(int *)(local_460.ray + 0x19c);
                      iVar28 = *(int *)(local_460.hit + 0x24);
                      iVar29 = *(int *)(local_460.hit + 0x28);
                      iVar30 = *(int *)(local_460.hit + 0x2c);
                      iVar31 = *(int *)(local_460.hit + 0x30);
                      iVar32 = *(int *)(local_460.hit + 0x34);
                      iVar33 = *(int *)(local_460.hit + 0x38);
                      iVar34 = *(int *)(local_460.hit + 0x3c);
                      bVar46 = (bool)((byte)(uVar43 >> 1) & 1);
                      bVar47 = (bool)((byte)(uVar43 >> 2) & 1);
                      bVar44 = (bool)((byte)(uVar43 >> 3) & 1);
                      bVar45 = (bool)((byte)(uVar43 >> 4) & 1);
                      bVar13 = (bool)((byte)(uVar43 >> 5) & 1);
                      bVar14 = (bool)((byte)(uVar43 >> 6) & 1);
                      bVar15 = SUB81(uVar43 >> 7,0);
                      *(uint *)(local_460.ray + 0x1a0) =
                           (uint)(bVar35 & 1) * *(int *)(local_460.hit + 0x20) |
                           (uint)!(bool)(bVar35 & 1) * *(int *)(local_460.ray + 0x1a0);
                      *(uint *)(local_460.ray + 0x1a4) =
                           (uint)bVar46 * iVar28 | (uint)!bVar46 * *(int *)(local_460.ray + 0x1a4);
                      *(uint *)(local_460.ray + 0x1a8) =
                           (uint)bVar47 * iVar29 | (uint)!bVar47 * *(int *)(local_460.ray + 0x1a8);
                      *(uint *)(local_460.ray + 0x1ac) =
                           (uint)bVar44 * iVar30 | (uint)!bVar44 * *(int *)(local_460.ray + 0x1ac);
                      *(uint *)(local_460.ray + 0x1b0) =
                           (uint)bVar45 * iVar31 | (uint)!bVar45 * *(int *)(local_460.ray + 0x1b0);
                      *(uint *)(local_460.ray + 0x1b4) =
                           (uint)bVar13 * iVar32 | (uint)!bVar13 * *(int *)(local_460.ray + 0x1b4);
                      *(uint *)(local_460.ray + 0x1b8) =
                           (uint)bVar14 * iVar33 | (uint)!bVar14 * *(int *)(local_460.ray + 0x1b8);
                      *(uint *)(local_460.ray + 0x1bc) =
                           (uint)bVar15 * iVar34 | (uint)!bVar15 * *(int *)(local_460.ray + 0x1bc);
                      iVar28 = *(int *)(local_460.hit + 0x44);
                      iVar29 = *(int *)(local_460.hit + 0x48);
                      iVar30 = *(int *)(local_460.hit + 0x4c);
                      iVar31 = *(int *)(local_460.hit + 0x50);
                      iVar32 = *(int *)(local_460.hit + 0x54);
                      iVar33 = *(int *)(local_460.hit + 0x58);
                      iVar34 = *(int *)(local_460.hit + 0x5c);
                      bVar46 = (bool)((byte)(uVar43 >> 1) & 1);
                      bVar47 = (bool)((byte)(uVar43 >> 2) & 1);
                      bVar44 = (bool)((byte)(uVar43 >> 3) & 1);
                      bVar45 = (bool)((byte)(uVar43 >> 4) & 1);
                      bVar13 = (bool)((byte)(uVar43 >> 5) & 1);
                      bVar14 = (bool)((byte)(uVar43 >> 6) & 1);
                      bVar15 = SUB81(uVar43 >> 7,0);
                      *(uint *)(local_460.ray + 0x1c0) =
                           (uint)(bVar35 & 1) * *(int *)(local_460.hit + 0x40) |
                           (uint)!(bool)(bVar35 & 1) * *(int *)(local_460.ray + 0x1c0);
                      *(uint *)(local_460.ray + 0x1c4) =
                           (uint)bVar46 * iVar28 | (uint)!bVar46 * *(int *)(local_460.ray + 0x1c4);
                      *(uint *)(local_460.ray + 0x1c8) =
                           (uint)bVar47 * iVar29 | (uint)!bVar47 * *(int *)(local_460.ray + 0x1c8);
                      *(uint *)(local_460.ray + 0x1cc) =
                           (uint)bVar44 * iVar30 | (uint)!bVar44 * *(int *)(local_460.ray + 0x1cc);
                      *(uint *)(local_460.ray + 0x1d0) =
                           (uint)bVar45 * iVar31 | (uint)!bVar45 * *(int *)(local_460.ray + 0x1d0);
                      *(uint *)(local_460.ray + 0x1d4) =
                           (uint)bVar13 * iVar32 | (uint)!bVar13 * *(int *)(local_460.ray + 0x1d4);
                      *(uint *)(local_460.ray + 0x1d8) =
                           (uint)bVar14 * iVar33 | (uint)!bVar14 * *(int *)(local_460.ray + 0x1d8);
                      *(uint *)(local_460.ray + 0x1dc) =
                           (uint)bVar15 * iVar34 | (uint)!bVar15 * *(int *)(local_460.ray + 0x1dc);
                      iVar28 = *(int *)(local_460.hit + 100);
                      iVar29 = *(int *)(local_460.hit + 0x68);
                      iVar30 = *(int *)(local_460.hit + 0x6c);
                      iVar31 = *(int *)(local_460.hit + 0x70);
                      iVar32 = *(int *)(local_460.hit + 0x74);
                      iVar33 = *(int *)(local_460.hit + 0x78);
                      iVar34 = *(int *)(local_460.hit + 0x7c);
                      bVar46 = (bool)((byte)(uVar43 >> 1) & 1);
                      bVar47 = (bool)((byte)(uVar43 >> 2) & 1);
                      bVar44 = (bool)((byte)(uVar43 >> 3) & 1);
                      bVar45 = (bool)((byte)(uVar43 >> 4) & 1);
                      bVar13 = (bool)((byte)(uVar43 >> 5) & 1);
                      bVar14 = (bool)((byte)(uVar43 >> 6) & 1);
                      bVar15 = SUB81(uVar43 >> 7,0);
                      *(uint *)(local_460.ray + 0x1e0) =
                           (uint)(bVar35 & 1) * *(int *)(local_460.hit + 0x60) |
                           (uint)!(bool)(bVar35 & 1) * *(int *)(local_460.ray + 0x1e0);
                      *(uint *)(local_460.ray + 0x1e4) =
                           (uint)bVar46 * iVar28 | (uint)!bVar46 * *(int *)(local_460.ray + 0x1e4);
                      *(uint *)(local_460.ray + 0x1e8) =
                           (uint)bVar47 * iVar29 | (uint)!bVar47 * *(int *)(local_460.ray + 0x1e8);
                      *(uint *)(local_460.ray + 0x1ec) =
                           (uint)bVar44 * iVar30 | (uint)!bVar44 * *(int *)(local_460.ray + 0x1ec);
                      *(uint *)(local_460.ray + 0x1f0) =
                           (uint)bVar45 * iVar31 | (uint)!bVar45 * *(int *)(local_460.ray + 0x1f0);
                      *(uint *)(local_460.ray + 500) =
                           (uint)bVar13 * iVar32 | (uint)!bVar13 * *(int *)(local_460.ray + 500);
                      *(uint *)(local_460.ray + 0x1f8) =
                           (uint)bVar14 * iVar33 | (uint)!bVar14 * *(int *)(local_460.ray + 0x1f8);
                      *(uint *)(local_460.ray + 0x1fc) =
                           (uint)bVar15 * iVar34 | (uint)!bVar15 * *(int *)(local_460.ray + 0x1fc);
                      iVar28 = *(int *)(local_460.hit + 0x84);
                      iVar29 = *(int *)(local_460.hit + 0x88);
                      iVar30 = *(int *)(local_460.hit + 0x8c);
                      iVar31 = *(int *)(local_460.hit + 0x90);
                      iVar32 = *(int *)(local_460.hit + 0x94);
                      iVar33 = *(int *)(local_460.hit + 0x98);
                      iVar34 = *(int *)(local_460.hit + 0x9c);
                      bVar46 = (bool)((byte)(uVar43 >> 1) & 1);
                      bVar47 = (bool)((byte)(uVar43 >> 2) & 1);
                      bVar44 = (bool)((byte)(uVar43 >> 3) & 1);
                      bVar45 = (bool)((byte)(uVar43 >> 4) & 1);
                      bVar13 = (bool)((byte)(uVar43 >> 5) & 1);
                      bVar14 = (bool)((byte)(uVar43 >> 6) & 1);
                      bVar15 = SUB81(uVar43 >> 7,0);
                      *(uint *)(local_460.ray + 0x200) =
                           (uint)(bVar35 & 1) * *(int *)(local_460.hit + 0x80) |
                           (uint)!(bool)(bVar35 & 1) * *(int *)(local_460.ray + 0x200);
                      *(uint *)(local_460.ray + 0x204) =
                           (uint)bVar46 * iVar28 | (uint)!bVar46 * *(int *)(local_460.ray + 0x204);
                      *(uint *)(local_460.ray + 0x208) =
                           (uint)bVar47 * iVar29 | (uint)!bVar47 * *(int *)(local_460.ray + 0x208);
                      *(uint *)(local_460.ray + 0x20c) =
                           (uint)bVar44 * iVar30 | (uint)!bVar44 * *(int *)(local_460.ray + 0x20c);
                      *(uint *)(local_460.ray + 0x210) =
                           (uint)bVar45 * iVar31 | (uint)!bVar45 * *(int *)(local_460.ray + 0x210);
                      *(uint *)(local_460.ray + 0x214) =
                           (uint)bVar13 * iVar32 | (uint)!bVar13 * *(int *)(local_460.ray + 0x214);
                      *(uint *)(local_460.ray + 0x218) =
                           (uint)bVar14 * iVar33 | (uint)!bVar14 * *(int *)(local_460.ray + 0x218);
                      *(uint *)(local_460.ray + 0x21c) =
                           (uint)bVar15 * iVar34 | (uint)!bVar15 * *(int *)(local_460.ray + 0x21c);
                      auVar82 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_460.hit + 0xa0));
                      *(undefined1 (*) [32])(local_460.ray + 0x220) = auVar82;
                      auVar82 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_460.hit + 0xc0));
                      *(undefined1 (*) [32])(local_460.ray + 0x240) = auVar82;
                      auVar82 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_460.hit + 0xe0));
                      *(undefined1 (*) [32])(local_460.ray + 0x260) = auVar82;
                      auVar82 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_460.hit + 0x100));
                      *(undefined1 (*) [32])(local_460.ray + 0x280) = auVar82;
                      goto LAB_019fc1b6;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x100) = fVar222;
                }
              }
            }
          }
        }
      }
      goto LAB_019fc1b6;
    }
    auVar50 = vinsertps_avx(auVar153,auVar64,0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }